

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void malloc_conf_init_helper
               (sc_data_t *sc_data,uint *bin_shard_sizes,_Bool initial_call,char **opts_cache,
               char *readlink_buf)

{
  fxp_t a;
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  _Bool *p_Var5;
  uint *puVar6;
  uintmax_t uVar7;
  thp_mode_t *ptVar8;
  int *piVar9;
  uintmax_t uVar10;
  char *pcVar11;
  ulong uVar12;
  int64_t *piVar13;
  hpa_shard_opts_t *phVar14;
  size_t *psVar15;
  char *pcVar16;
  long lVar17;
  char *unaff_RBP;
  char *pcVar18;
  undefined8 uVar19;
  char *__s2;
  ulong uVar20;
  bool bVar21;
  size_t vlen_left;
  size_t nshards;
  char *end;
  size_t size_start;
  size_t size_end;
  char *local_1c8;
  char *local_1b8;
  char *local_1a8 [3];
  int local_190;
  undefined4 uStack_18c;
  sc_data_t *local_188;
  char *local_180;
  ulong local_178;
  char **local_170;
  char *local_168 [32];
  size_t local_68 [3];
  uint *local_50;
  size_t local_48 [3];
  
  uVar20 = 0;
  local_188 = sc_data;
  local_180 = readlink_buf;
  local_170 = opts_cache;
  local_50 = bin_shard_sizes;
  do {
    if (initial_call) {
      (*(code *)((long)&DAT_01ed84c4 + (long)(int)(&DAT_01ed84c4)[uVar20 & 0xffffffff]))();
      return;
    }
    __s2 = local_170[uVar20];
    if (duckdb_je_opt_confirm_conf == true) {
      pcVar11 = __s2;
      if (__s2 == (char *)0x0) {
        pcVar11 = anon_var_dwarf_63b5960 + 9;
      }
      duckdb_je_malloc_printf
                ("<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",(ulong)((int)uVar20 + 1),
                 (long)&malloc_conf_init_helper_opts_explain_rel +
                 (long)(int)(&malloc_conf_init_helper_opts_explain_rel)[uVar20],pcVar11);
    }
    if (__s2 != (char *)0x0) {
      local_178 = uVar20;
      if (*__s2 != '\0') {
LAB_01c5db79:
        bVar21 = false;
        pcVar11 = __s2;
LAB_01c5db8d:
        pcVar16 = __s2;
        switch(*pcVar11) {
        case '\0':
          if (pcVar11 == __s2) goto LAB_01c5dc3a;
          pcVar11 = pcVar11 + -1;
          pcVar18 = "Conf string ends with key";
          break;
        default:
          pcVar18 = "Malformed conf string";
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
        case 'A':
        case 'B':
        case 'C':
        case 'D':
        case 'E':
        case 'F':
        case 'G':
        case 'H':
        case 'I':
        case 'J':
        case 'K':
        case 'L':
        case 'M':
        case 'N':
        case 'O':
        case 'P':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
        case 'U':
        case 'V':
        case 'W':
        case 'X':
        case 'Y':
        case 'Z':
        case '_':
        case 'a':
        case 'b':
        case 'c':
        case 'd':
        case 'e':
        case 'f':
        case 'g':
        case 'h':
        case 'i':
        case 'j':
        case 'k':
        case 'l':
        case 'm':
        case 'n':
        case 'o':
        case 'p':
        case 'q':
        case 'r':
        case 's':
        case 't':
        case 'u':
        case 'v':
        case 'w':
        case 'x':
        case 'y':
        case 'z':
          goto LAB_01c5dba8;
        case ':':
          local_1b8 = pcVar11 + ~(ulong)__s2 + 1;
          local_1c8 = pcVar11 + 1;
          bVar21 = true;
LAB_01c5dba8:
          pcVar11 = pcVar11 + 1;
          if (bVar21) goto LAB_01c5dbc5;
          goto LAB_01c5db8d;
        }
        pcVar11 = pcVar11 + (1 - (long)__s2);
        if ((char *)0x3f < pcVar11) {
          pcVar11 = (char *)0x40;
        }
        duckdb_je_malloc_printf("<jemalloc>: %s -- %.*s\n",pcVar18,(ulong)pcVar11 & 0xffffffff,__s2)
        ;
        had_conf_error = '\x01';
        goto LAB_01c5dc3a;
      }
LAB_01c60a4f:
      _Var3 = duckdb_je_hpa_supported();
      a = duckdb_je_opt_hpa_opts.dirty_mult;
      if (((_Var3) && ((duckdb_je_opt_hpa_opts.dirty_mult != 0xffffffff & duckdb_je_opt_hpa) == 1))
         && (uVar20 = (ulong)duckdb_je_opt_hpa_opts.dirty_mult * 0x20 +
                      duckdb_je_opt_hpa_opts.hugification_threshold, uVar20 < 0x200001)) {
        had_conf_error = '\x01';
        switchD_0105b559::default(local_168,0,0x100);
        duckdb_je_fxp_print(a,(char *)local_1a8);
        duckdb_je_fxp_print((uint)duckdb_je_opt_hpa_opts.hugification_threshold >> 5 & 0x7fff80,
                            (char *)local_68);
        if (duckdb_je_opt_abort_conf == false) {
          duckdb_je_opt_hpa_opts.hugification_threshold =
               (duckdb_je_opt_hpa_opts.hugification_threshold - uVar20) + 0x200000;
          duckdb_je_fxp_print((uint)(duckdb_je_opt_hpa_opts.hugification_threshold >> 5) & 0x7fff80,
                              (char *)local_48);
          duckdb_je_malloc_snprintf
                    ((char *)local_168,0x100,
                     "<jemalloc>: Normalizing HPA settings to avoid pathological behavior, setting hpa_hugification_threshold_ratio: to %s.\n"
                     ,local_48);
        }
        duckdb_je_malloc_printf
                  ("<jemalloc>: Invalid combination of options hpa_hugification_threshold_ratio: %s and hpa_dirty_mult: %s. These values should sum to > 1.0.\n%s"
                   ,local_68,local_1a8,local_168);
      }
      uVar20 = local_178;
      if ((duckdb_je_opt_abort_conf == true) && (had_conf_error == '\x01')) {
        duckdb_je_malloc_printf
                  ("<jemalloc>: Abort (abort_conf:true) on invalid conf value (see above).\n");
        abort();
      }
    }
    uVar20 = uVar20 + 1;
    if (uVar20 == 5) {
      duckdb_je_log_init_done.repr = true;
      return;
    }
  } while( true );
LAB_01c5dbc5:
  bVar1 = false;
  do {
    if (*pcVar11 == '\0') {
      unaff_RBP = pcVar11 + -(long)local_1c8;
LAB_01c5dc2f:
      bVar1 = true;
    }
    else {
      if (*pcVar11 == ',') {
        if (pcVar11[1] == '\0') {
          pcVar16 = pcVar11 + (1 - (long)__s2);
          if ((char *)0x3f < pcVar16) {
            pcVar16 = (char *)0x40;
          }
          duckdb_je_malloc_printf("<jemalloc>: %s -- %.*s\n","Conf string ends with comma",pcVar16);
          had_conf_error = '\x01';
        }
        pcVar11 = pcVar11 + 1;
        unaff_RBP = pcVar11 + ~(ulong)local_1c8;
        goto LAB_01c5dc2f;
      }
      pcVar11 = pcVar11 + 1;
    }
    pcVar16 = pcVar11;
  } while (!bVar1);
LAB_01c5dc3a:
  if (!bVar21) goto LAB_01c60a4f;
  if ((local_1b8 == (char *)0xc) && (iVar4 = strncmp("confirm_conf",__s2,0xc), iVar4 == 0)) {
    if (unaff_RBP == (char *)0x5) {
      iVar4 = strncmp("false",local_1c8,5);
      if (iVar4 != 0) goto LAB_01c5e4be;
      duckdb_je_opt_confirm_conf = false;
LAB_01c5e7a8:
      bVar2 = 1;
    }
    else {
      if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
        duckdb_je_opt_confirm_conf = true;
        goto LAB_01c5e7a8;
      }
LAB_01c5e4be:
      bVar2 = 1;
      if (!initial_call) {
        malloc_conf_error("Invalid conf value",__s2,0xc,local_1c8,(size_t)unaff_RBP);
        bVar2 = 0;
      }
    }
    if ((bVar2 & duckdb_je_opt_confirm_conf & !initial_call) != 1) goto LAB_01c5ee03;
LAB_01c5e7bf:
    uVar20 = 0xc;
LAB_01c5edf6:
    uVar12 = (ulong)unaff_RBP & 0xffffffff;
  }
  else {
    if (initial_call) goto LAB_01c5ee03;
    if ((local_1b8 == (char *)0x5) && (iVar4 = strncmp("abort",__s2,5), iVar4 == 0)) {
      if (unaff_RBP == (char *)0x5) {
        iVar4 = strncmp("false",local_1c8,5);
        if (iVar4 != 0) goto LAB_01c5e535;
        duckdb_je_opt_abort = false;
LAB_01c5e98b:
        bVar21 = true;
      }
      else {
        if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
          duckdb_je_opt_abort = true;
          goto LAB_01c5e98b;
        }
LAB_01c5e535:
        malloc_conf_error("Invalid conf value",__s2,5,local_1c8,(size_t)unaff_RBP);
        bVar21 = false;
      }
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
      uVar20 = 5;
      goto LAB_01c5edf6;
    }
    if ((local_1b8 == (char *)0xa) && (iVar4 = strncmp("abort_conf",__s2,10), iVar4 == 0)) {
      if (unaff_RBP == (char *)0x5) {
        iVar4 = strncmp("false",local_1c8,5);
        if (iVar4 != 0) goto LAB_01c5e5f7;
        duckdb_je_opt_abort_conf = false;
LAB_01c5ea7f:
        bVar21 = true;
      }
      else {
        if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
          duckdb_je_opt_abort_conf = true;
          goto LAB_01c5ea7f;
        }
LAB_01c5e5f7:
        malloc_conf_error("Invalid conf value",__s2,10,local_1c8,(size_t)unaff_RBP);
        bVar21 = false;
      }
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
LAB_01c5ea99:
      uVar20 = 10;
      goto LAB_01c5edf6;
    }
    if ((local_1b8 == (char *)0xf) && (iVar4 = strncmp("cache_oblivious",__s2,0xf), iVar4 == 0)) {
      if (unaff_RBP == (char *)0x5) {
        iVar4 = strncmp("false",local_1c8,5);
        if (iVar4 != 0) goto LAB_01c5e663;
        duckdb_je_opt_cache_oblivious = false;
LAB_01c5ebb8:
        bVar21 = true;
      }
      else {
        if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
          duckdb_je_opt_cache_oblivious = true;
          goto LAB_01c5ebb8;
        }
LAB_01c5e663:
        malloc_conf_error("Invalid conf value",__s2,0xf,local_1c8,(size_t)unaff_RBP);
        bVar21 = false;
      }
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
      uVar20 = 0xf;
      goto LAB_01c5edf6;
    }
    if ((local_1b8 == (char *)0xd) && (iVar4 = strncmp("trust_madvise",__s2,0xd), iVar4 == 0)) {
      if (unaff_RBP == (char *)0x5) {
        iVar4 = strncmp("false",local_1c8,5);
        if (iVar4 != 0) goto LAB_01c5e6cf;
        duckdb_je_opt_trust_madvise = false;
LAB_01c5ec46:
        bVar21 = true;
      }
      else {
        if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
          duckdb_je_opt_trust_madvise = true;
          goto LAB_01c5ec46;
        }
LAB_01c5e6cf:
        malloc_conf_error("Invalid conf value",__s2,0xd,local_1c8,(size_t)unaff_RBP);
        bVar21 = false;
      }
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
      uVar20 = 0xd;
      goto LAB_01c5edf6;
    }
    iVar4 = strncmp("metadata_thp",__s2,(size_t)local_1b8);
    if (iVar4 == 0) {
      iVar4 = strncmp("disabled",local_1c8,(size_t)unaff_RBP);
      if (iVar4 == 0) {
        bVar21 = true;
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        do {
          uVar12 = uVar20;
          bVar21 = uVar12 < 2;
          if (uVar12 == 2) {
            malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,
                              (size_t)unaff_RBP);
            goto LAB_01c5e7ee;
          }
          iVar4 = strncmp(duckdb_je_metadata_thp_mode_names[uVar12 + 1],local_1c8,(size_t)unaff_RBP)
          ;
          uVar20 = uVar12 + 1;
        } while (iVar4 != 0);
        bVar21 = uVar12 < 2;
      }
      duckdb_je_opt_metadata_thp = (metadata_thp_mode_t)uVar20;
LAB_01c5e7ee:
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
LAB_01c5e9e3:
      uVar20 = (ulong)local_1b8 & 0xffffffff;
      goto LAB_01c5edf6;
    }
    if ((local_1b8 == (char *)0x6) && (iVar4 = strncmp("retain",__s2,6), iVar4 == 0)) {
      if (unaff_RBP == (char *)0x5) {
        iVar4 = strncmp("false",local_1c8,5);
        if (iVar4 == 0) {
          p_Var5 = &duckdb_je_opt_retain;
LAB_01c5ed7c:
          *p_Var5 = false;
          goto LAB_01c5edd5;
        }
LAB_01c5e85d:
        malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
        bVar21 = false;
      }
      else {
        if ((unaff_RBP != (char *)0x4) || (iVar4 = strncmp("true",local_1c8,4), iVar4 != 0))
        goto LAB_01c5e85d;
        p_Var5 = &duckdb_je_opt_retain;
LAB_01c5edd2:
        *p_Var5 = true;
LAB_01c5edd5:
        bVar21 = true;
      }
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
      uVar20 = 6;
      goto LAB_01c5edf6;
    }
    iVar4 = strncmp("dss",__s2,(size_t)local_1b8);
    if (iVar4 == 0) {
      bVar2 = 1;
      lVar17 = 0;
      do {
        pcVar11 = duckdb_je_dss_prec_names[lVar17];
        iVar4 = strncmp(pcVar11,local_1c8,(size_t)unaff_RBP);
        if (iVar4 == 0) {
          _Var3 = duckdb_je_extent_dss_prec_set((dss_prec_t)lVar17);
          if (!_Var3) goto LAB_01c5e9ca;
          malloc_conf_error("Error setting dss",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
          bVar2 = 0;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
      bVar2 = 0;
      pcVar11 = duckdb_je_opt_dss;
LAB_01c5e9ca:
      duckdb_je_opt_dss = pcVar11;
      if ((bVar2 & duckdb_je_opt_confirm_conf) != 1) goto LAB_01c5ee03;
      goto LAB_01c5e9e3;
    }
    if ((local_1b8 != (char *)0x7) || (iVar4 = strncmp("narenas",__s2,7), iVar4 != 0)) {
      if ((local_1b8 == (char *)0xd) && (iVar4 = strncmp("narenas_ratio",__s2,0xd), iVar4 == 0)) {
        _Var3 = duckdb_je_fxp_parse(&duckdb_je_opt_narenas_ratio,local_1c8,local_168);
        if ((_Var3) || (bVar21 = true, local_168[0] + -(long)local_1c8 != unaff_RBP)) {
          malloc_conf_error("Invalid conf value",__s2,0xd,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0xd;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0xa) && (iVar4 = strncmp("bin_shards",__s2,10), iVar4 == 0)) {
        bVar21 = true;
        local_1a8[0] = unaff_RBP;
        local_168[0] = local_1c8;
        do {
          _Var3 = duckdb_je_multi_setting_parse_next
                            (local_168,(size_t *)local_1a8,local_68,local_48,(size_t *)&local_190);
          if ((_Var3) ||
             (_Var3 = duckdb_je_bin_update_shard_size
                                (local_50,local_68[0],local_48[0],CONCAT44(uStack_18c,local_190)),
             _Var3)) {
            malloc_conf_error("Invalid settings for bin_shards",__s2,10,local_1c8,(size_t)unaff_RBP)
            ;
            bVar1 = true;
            bVar21 = false;
          }
          else {
            bVar1 = false;
          }
        } while ((!bVar1) && (local_1a8[0] != (char *)0x0));
        if ((duckdb_je_opt_confirm_conf != true) || (!bVar21)) goto LAB_01c5ee03;
        goto LAB_01c5ea99;
      }
      if ((local_1b8 == (char *)0x10) && (iVar4 = strncmp("max_batched_size",__s2,0x10), iVar4 == 0)
         ) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          bVar21 = true;
          duckdb_je_opt_bin_info_max_batched_size = uVar10;
        }
        else {
          malloc_conf_error("Invalid conf value",__s2,0x10,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x10;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x15) &&
         (iVar4 = strncmp("remote_free_max_batch",__s2,0x15), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          duckdb_je_opt_bin_info_remote_free_max_batch = uVar10;
          if (0x10 < uVar10) {
            duckdb_je_opt_bin_info_remote_free_max_batch = 0x10;
          }
          bVar21 = true;
        }
        else {
LAB_01c5f707:
          malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP)
          ;
          bVar21 = false;
        }
LAB_01c5f728:
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x15;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0xf) && (iVar4 = strncmp("remote_free_max",__s2,0xf), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          duckdb_je_opt_bin_info_remote_free_max = uVar10;
          if (0x10 < uVar10) {
            duckdb_je_opt_bin_info_remote_free_max = 0x10;
          }
          bVar21 = true;
        }
        else {
LAB_01c601d8:
          malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP)
          ;
          bVar21 = false;
        }
LAB_01c601f9:
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0xf;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x12) &&
         (iVar4 = strncmp("tcache_ncached_max",__s2,0x12), iVar4 == 0)) {
        _Var3 = tcache_bin_info_default_init(local_1c8,(size_t)unaff_RBP);
        if (_Var3) {
          malloc_conf_error("Invalid settings for tcache_ncached_max",__s2,0x12,local_1c8,
                            (size_t)unaff_RBP);
        }
        if (_Var3 || duckdb_je_opt_confirm_conf != true) goto LAB_01c5ee03;
        uVar20 = 0x12;
        goto LAB_01c5edf6;
      }
      if (local_1b8 == (char *)0xe) {
        iVar4 = strncmp("mutex_max_spin",__s2,0xe);
        if (iVar4 == 0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
            if (-2 < (long)uVar10) {
              piVar13 = &duckdb_je_opt_mutex_max_spin;
              goto LAB_01c5fbef;
            }
LAB_01c5f480:
            pcVar11 = "Out-of-range conf value";
          }
          else {
LAB_01c5f48c:
            pcVar11 = "Invalid conf value";
          }
          malloc_conf_error(pcVar11,__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        else {
          iVar4 = strncmp("dirty_decay_ms",__s2,0xe);
          if (iVar4 == 0) {
            piVar9 = __errno_location();
            *piVar9 = 0;
            uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
            if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5f48c;
            if (uVar10 - 0x10c6f7a0af41 < 0xffffef39085f50be) goto LAB_01c5f480;
            piVar13 = &duckdb_je_opt_dirty_decay_ms;
          }
          else {
            iVar4 = strncmp("muzzy_decay_ms",__s2,0xe);
            if (iVar4 != 0) goto LAB_01c5deae;
            piVar9 = __errno_location();
            *piVar9 = 0;
            uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
            if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5f48c;
            if (uVar10 - 0x10c6f7a0af41 < 0xffffef39085f50be) goto LAB_01c5f480;
            piVar13 = &duckdb_je_opt_muzzy_decay_ms;
          }
LAB_01c5fbef:
          *piVar13 = uVar10;
          bVar21 = true;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0xe;
        goto LAB_01c5edf6;
      }
LAB_01c5deae:
      if ((local_1b8 == (char *)0xb) && (iVar4 = strncmp("stats_print",__s2,0xb), iVar4 == 0)) {
        if (unaff_RBP == (char *)0x5) {
          iVar4 = strncmp("false",local_1c8,5);
          if (iVar4 != 0) goto LAB_01c5eef0;
          duckdb_je_opt_stats_print = false;
LAB_01c5f4e0:
          bVar21 = true;
        }
        else {
          if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
            duckdb_je_opt_stats_print = true;
            goto LAB_01c5f4e0;
          }
LAB_01c5eef0:
          malloc_conf_error("Invalid conf value",__s2,0xb,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0xb;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x10) && (iVar4 = strncmp("stats_print_opts",__s2,0x10), iVar4 == 0)
         ) {
        init_opt_stats_opts(local_1c8,(size_t)unaff_RBP,duckdb_je_opt_stats_print_opts);
        if (duckdb_je_opt_confirm_conf != true) goto LAB_01c5ee03;
        uVar20 = 0x10;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0xe) && (iVar4 = strncmp("stats_interval",__s2,0xe), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5f48c;
        if ((long)uVar10 < -1) goto LAB_01c5f480;
        piVar13 = &duckdb_je_opt_stats_interval;
        goto LAB_01c5fbef;
      }
      if ((local_1b8 == (char *)0x13) &&
         (iVar4 = strncmp("stats_interval_opts",__s2,0x13), iVar4 == 0)) {
        init_opt_stats_opts(local_1c8,(size_t)unaff_RBP,duckdb_je_opt_stats_interval_opts);
        if (duckdb_je_opt_confirm_conf != true) goto LAB_01c5ee03;
        uVar20 = 0x13;
        goto LAB_01c5edf6;
      }
      if (local_1b8 == (char *)0x4) {
        iVar4 = strncmp("junk",__s2,4);
        if (iVar4 == 0) {
          if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
            duckdb_je_opt_junk = "true";
            bVar21 = true;
            duckdb_je_opt_junk_free = true;
            duckdb_je_opt_junk_alloc = true;
          }
          else {
            if (unaff_RBP == (char *)0x5) {
              iVar4 = strncmp("false",local_1c8,5);
              if (iVar4 == 0) {
                duckdb_je_opt_junk = "false";
                duckdb_je_opt_junk_free = false;
                duckdb_je_opt_junk_alloc = false;
                goto LAB_01c5fb23;
              }
              iVar4 = strncmp("alloc",local_1c8,5);
              if (iVar4 == 0) {
                duckdb_je_opt_junk = "alloc";
                duckdb_je_opt_junk_alloc = true;
                p_Var5 = &duckdb_je_opt_junk_free;
                goto LAB_01c5fa63;
              }
            }
            if ((unaff_RBP != (char *)0x4) || (iVar4 = strncmp("free",local_1c8,4), iVar4 != 0))
            goto LAB_01c5f41a;
            duckdb_je_opt_junk = "free";
            duckdb_je_opt_junk_alloc = false;
            p_Var5 = &duckdb_je_opt_junk_free;
LAB_01c5fb20:
            *p_Var5 = true;
LAB_01c5fb23:
            bVar21 = true;
          }
        }
        else {
          iVar4 = strncmp("zero",__s2,4);
          if (iVar4 != 0) goto LAB_01c5df7a;
          if (unaff_RBP == (char *)0x5) {
            iVar4 = strncmp("false",local_1c8,5);
            if (iVar4 == 0) {
              p_Var5 = &duckdb_je_opt_zero;
LAB_01c5fa63:
              *p_Var5 = false;
              goto LAB_01c5fb23;
            }
          }
          else if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0))
          {
            p_Var5 = &duckdb_je_opt_zero;
            goto LAB_01c5fb20;
          }
LAB_01c5f41a:
          malloc_conf_error("Invalid conf value",__s2,4,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 4;
        goto LAB_01c5edf6;
      }
LAB_01c5df7a:
      if ((local_1b8 == (char *)0x1b) &&
         (iVar4 = strncmp("experimental_infallible_new",__s2,0x1b), iVar4 == 0)) {
        if (unaff_RBP == (char *)0x5) {
          iVar4 = strncmp("false",local_1c8,5);
          if (iVar4 != 0) goto LAB_01c5f14f;
          duckdb_je_opt_experimental_infallible_new = false;
LAB_01c5f7f0:
          bVar21 = true;
        }
        else {
          if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
            duckdb_je_opt_experimental_infallible_new = true;
            goto LAB_01c5f7f0;
          }
LAB_01c5f14f:
          malloc_conf_error("Invalid conf value",__s2,0x1b,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x1b;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x6) && (iVar4 = strncmp("tcache",__s2,6), iVar4 == 0)) {
        if (unaff_RBP == (char *)0x5) {
          iVar4 = strncmp("false",local_1c8,5);
          if (iVar4 == 0) {
            p_Var5 = &duckdb_je_opt_tcache;
            goto LAB_01c5ed7c;
          }
        }
        else if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
          p_Var5 = &duckdb_je_opt_tcache;
          goto LAB_01c5edd2;
        }
        goto LAB_01c5e85d;
      }
      if ((local_1b8 == (char *)0xa) && (iVar4 = strncmp("tcache_max",__s2,10), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        pcVar11 = (char *)duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          duckdb_je_opt_tcache_max = (size_t)pcVar11;
          if ("gMinMaxStateINS_8string_tENS_9hugeint_tEEEEEvRT_RNS_21AggregateFinalizeDataE" <=
              pcVar11) {
            duckdb_je_opt_tcache_max = 0x800000;
          }
          bVar21 = true;
        }
        else {
          malloc_conf_error("Invalid conf value",__s2,10,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 10;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0xd) && (iVar4 = strncmp("lg_tcache_max",__s2,0xd), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (0x16 < uVar10) {
            uVar10 = 0x17;
          }
          duckdb_je_opt_tcache_max = 1L << ((byte)uVar10 & 0x3f);
          bVar21 = true;
        }
        else {
          malloc_conf_error("Invalid conf value",__s2,0xd,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0xd;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x14) &&
         (iVar4 = strncmp("lg_tcache_nslots_mul",__s2,0x14), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (uVar10 - 0x11 < 0xffffffffffffffdf) {
            pcVar11 = "Out-of-range conf value";
            goto LAB_01c5f668;
          }
          psVar15 = (size_t *)&duckdb_je_opt_lg_tcache_nslots_mul;
LAB_01c5fce7:
          *psVar15 = uVar10;
LAB_01c5fcea:
          bVar21 = true;
        }
        else {
LAB_01c5f654:
          pcVar11 = "Invalid conf value";
LAB_01c5f668:
          malloc_conf_error(pcVar11,__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x14;
        goto LAB_01c5edf6;
      }
      if (local_1b8 == (char *)0x17) {
        iVar4 = strncmp("tcache_nslots_small_min",__s2,0x17);
        if (iVar4 == 0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5f87a;
          if (uVar10 == 0) {
            puVar6 = &duckdb_je_opt_tcache_nslots_small_min;
LAB_01c60021:
            *puVar6 = 1;
          }
          else {
            if (0x800 < uVar10) {
              puVar6 = &duckdb_je_opt_tcache_nslots_small_min;
              goto LAB_01c5f86f;
            }
            puVar6 = &duckdb_je_opt_tcache_nslots_small_min;
LAB_01c6008e:
            *puVar6 = (uint)uVar10;
          }
LAB_01c60090:
          bVar21 = true;
        }
        else {
          iVar4 = strncmp("tcache_nslots_small_max",__s2,0x17);
          if (iVar4 != 0) goto LAB_01c5e068;
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
            if (uVar10 == 0) {
              puVar6 = &duckdb_je_opt_tcache_nslots_small_max;
              goto LAB_01c60021;
            }
            if (uVar10 < 0x801) {
              puVar6 = &duckdb_je_opt_tcache_nslots_small_max;
              goto LAB_01c6008e;
            }
            puVar6 = &duckdb_je_opt_tcache_nslots_small_max;
LAB_01c5f86f:
            *puVar6 = 0x800;
            goto LAB_01c60090;
          }
LAB_01c5f87a:
          malloc_conf_error("Invalid conf value",__s2,0x17,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x17;
        goto LAB_01c5edf6;
      }
LAB_01c5e068:
      if ((local_1b8 == (char *)0x13) &&
         (iVar4 = strncmp("tcache_nslots_large",__s2,0x13), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (uVar10 == 0) {
            duckdb_je_opt_tcache_nslots_large = 1;
          }
          else if (uVar10 < 0x801) {
            duckdb_je_opt_tcache_nslots_large = (uint)uVar10;
          }
          else {
            duckdb_je_opt_tcache_nslots_large = 0x800;
          }
          bVar21 = true;
        }
        else {
LAB_01c5ffc4:
          malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP)
          ;
          bVar21 = false;
        }
LAB_01c5ffe5:
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x13;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x14) &&
         (iVar4 = strncmp("tcache_gc_incr_bytes",__s2,0x14), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (0x3ff < uVar10) {
            psVar15 = &duckdb_je_opt_tcache_gc_incr_bytes;
            goto LAB_01c5fce7;
          }
          duckdb_je_opt_tcache_gc_incr_bytes = 0x400;
          goto LAB_01c5fcea;
        }
        goto LAB_01c5f654;
      }
      if ((local_1b8 == (char *)0x15) &&
         (iVar4 = strncmp("tcache_gc_delay_bytes",__s2,0x15), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5f707;
        bVar21 = true;
        duckdb_je_opt_tcache_gc_delay_bytes = uVar10;
        goto LAB_01c5f728;
      }
      if (local_1b8 == (char *)0x19) {
        iVar4 = strncmp("lg_tcache_flush_small_div",__s2,0x19);
        if (iVar4 == 0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c6043e;
          if (uVar10 == 0) {
            puVar6 = &duckdb_je_opt_lg_tcache_flush_small_div;
LAB_01c60270:
            *puVar6 = 1;
          }
          else if (uVar10 < 0x11) {
            puVar6 = &duckdb_je_opt_lg_tcache_flush_small_div;
LAB_01c60322:
            *puVar6 = (uint)uVar10;
          }
          else {
            puVar6 = &duckdb_je_opt_lg_tcache_flush_small_div;
LAB_01c5fbd1:
            *puVar6 = 0x10;
          }
          bVar21 = true;
        }
        else {
          iVar4 = strncmp("lg_tcache_flush_large_div",__s2,0x19);
          if (iVar4 != 0) goto LAB_01c5e112;
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
            if (uVar10 != 0) {
              if (uVar10 < 0x11) {
                puVar6 = &duckdb_je_opt_lg_tcache_flush_large_div;
                goto LAB_01c60322;
              }
              puVar6 = &duckdb_je_opt_lg_tcache_flush_large_div;
              goto LAB_01c5fbd1;
            }
            puVar6 = &duckdb_je_opt_lg_tcache_flush_large_div;
            goto LAB_01c60270;
          }
LAB_01c6043e:
          malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP)
          ;
          bVar21 = false;
        }
LAB_01c6045f:
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x19;
        goto LAB_01c5edf6;
      }
LAB_01c5e112:
      if ((local_1b8 == (char *)0x1a) &&
         (iVar4 = strncmp("debug_double_free_max_scan",__s2,0x1a), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          duckdb_je_opt_debug_double_free_max_scan = (uint)uVar10;
          bVar21 = true;
        }
        else {
LAB_01c5fec2:
          malloc_conf_error("Invalid conf value",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP)
          ;
          bVar21 = false;
        }
LAB_01c5fee3:
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x1a;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x18) &&
         (iVar4 = strncmp("calloc_madvise_threshold",__s2,0x18), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (0x7000000000000000 < uVar10) {
LAB_01c5fac3:
            pcVar11 = "Out-of-range conf value";
            goto LAB_01c5fae3;
          }
          psVar15 = &duckdb_je_opt_calloc_madvise_threshold;
LAB_01c6010a:
          *psVar15 = uVar10;
          bVar21 = true;
        }
        else {
LAB_01c5facf:
          pcVar11 = "Invalid conf value";
LAB_01c5fae3:
          malloc_conf_error(pcVar11,__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x18;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x12) &&
         (iVar4 = strncmp("oversize_threshold",__s2,0x12), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (0x7000000000000000 < uVar10) {
            pcVar11 = "Out-of-range conf value";
            goto LAB_01c5fe24;
          }
          phVar14 = (hpa_shard_opts_t *)&duckdb_je_opt_oversize_threshold;
LAB_01c6007d:
          phVar14->slab_max_alloc = uVar10;
LAB_01c60080:
          bVar21 = true;
        }
        else {
LAB_01c5fe10:
          pcVar11 = "Invalid conf value";
LAB_01c5fe24:
          malloc_conf_error(pcVar11,__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x12;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x18) &&
         (iVar4 = strncmp("lg_extent_max_active_fit",__s2,0x18), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (uVar10 < 0x41) {
            psVar15 = &duckdb_je_opt_lg_extent_max_active_fit;
            goto LAB_01c6010a;
          }
          goto LAB_01c5fac3;
        }
        goto LAB_01c5facf;
      }
      iVar4 = strncmp("percpu_arena",__s2,(size_t)local_1b8);
      if (iVar4 == 0) {
        lVar17 = 0;
        do {
          iVar4 = strncmp(duckdb_je_percpu_arena_mode_names[lVar17],local_1c8,(size_t)unaff_RBP);
          if (iVar4 == 0) {
            malloc_conf_error("No getcpu support",__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP
                             );
            ptVar8 = &duckdb_je_opt_percpu_arena;
            goto LAB_01c5fb70;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
LAB_01c5f951:
        pcVar11 = "Invalid conf value";
LAB_01c5f960:
        malloc_conf_error(pcVar11,__s2,(size_t)local_1b8,local_1c8,(size_t)unaff_RBP);
        goto LAB_01c5ee03;
      }
      if ((local_1b8 == (char *)0x11) &&
         (iVar4 = strncmp("background_thread",__s2,0x11), iVar4 == 0)) {
        if (unaff_RBP == (char *)0x5) {
          iVar4 = strncmp("false",local_1c8,5);
          if (iVar4 != 0) goto LAB_01c5fc45;
          duckdb_je_opt_background_thread = false;
LAB_01c6022f:
          bVar21 = true;
        }
        else {
          if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
            duckdb_je_opt_background_thread = true;
            goto LAB_01c6022f;
          }
LAB_01c5fc45:
          malloc_conf_error("Invalid conf value",__s2,0x11,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x11;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x16) &&
         (iVar4 = strncmp("max_background_threads",__s2,0x16), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (uVar10 == 0) {
            duckdb_je_opt_max_background_threads = 1;
            bVar21 = true;
          }
          else {
            bVar21 = true;
            if (uVar10 <= duckdb_je_opt_max_background_threads) {
              duckdb_je_opt_max_background_threads = uVar10;
            }
          }
        }
        else {
          malloc_conf_error("Invalid conf value",__s2,0x16,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x16;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x3) && (iVar4 = strncmp("hpa",__s2,3), iVar4 == 0)) {
        if (unaff_RBP == (char *)0x5) {
          iVar4 = strncmp("false",local_1c8,5);
          if (iVar4 != 0) goto LAB_01c5fd3d;
          duckdb_je_opt_hpa = false;
LAB_01c603c0:
          bVar21 = true;
        }
        else {
          if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
            duckdb_je_opt_hpa = true;
            goto LAB_01c603c0;
          }
LAB_01c5fd3d:
          malloc_conf_error("Invalid conf value",__s2,3,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 3;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x12) &&
         (iVar4 = strncmp("hpa_slab_max_alloc",__s2,0x12), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          if (uVar10 < 0x1000) {
            duckdb_je_opt_hpa_opts.slab_max_alloc = 0x1000;
          }
          else {
            if (uVar10 < 0x200001) {
              phVar14 = &duckdb_je_opt_hpa_opts;
              goto LAB_01c6007d;
            }
            duckdb_je_opt_hpa_opts.slab_max_alloc = 0x200000;
          }
          goto LAB_01c60080;
        }
        goto LAB_01c5fe10;
      }
      if ((local_1b8 == (char *)0x1a) &&
         (iVar4 = strncmp("hpa_hugification_threshold",__s2,0x1a), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5fec2;
        if (uVar10 < 0x1000) {
          duckdb_je_opt_hpa_opts.hugification_threshold = 0x1000;
        }
        else {
          duckdb_je_opt_hpa_opts.hugification_threshold = uVar10;
          if (0x200000 < uVar10) {
            duckdb_je_opt_hpa_opts.hugification_threshold = 0x200000;
          }
        }
        bVar21 = true;
        goto LAB_01c5fee3;
      }
      if ((local_1b8 == (char *)0x20) &&
         (iVar4 = strncmp("hpa_hugification_threshold_ratio",__s2,0x20), iVar4 == 0)) {
        _Var3 = duckdb_je_fxp_parse((fxp_t *)local_1a8,local_1c8,local_168);
        if ((_Var3) ||
           (0x10000 < (uint)local_1a8[0] || local_168[0] + -(long)local_1c8 != unaff_RBP)) {
          malloc_conf_error("Invalid conf value",__s2,0x20,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        else {
          duckdb_je_opt_hpa_opts.hugification_threshold = ((ulong)local_1a8[0] & 0xffffffff) << 5;
          bVar21 = true;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x20;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0x13) &&
         (iVar4 = strncmp("hpa_hugify_delay_ms",__s2,0x13), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c5ffc4;
        bVar21 = true;
        duckdb_je_opt_hpa_opts.hugify_delay_ms = uVar10;
        goto LAB_01c5ffe5;
      }
      if ((local_1b8 == (char *)0x19) &&
         (iVar4 = strncmp("hpa_min_purge_interval_ms",__s2,0x19), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c6043e;
LAB_01c6096f:
        duckdb_je_opt_hpa_opts.min_purge_interval_ms = uVar10;
        bVar21 = true;
        goto LAB_01c6045f;
      }
      if ((local_1b8 == &DAT_0000001d) &&
         (iVar4 = strncmp("hpa_strict_min_purge_interval",__s2,0x1d), iVar4 == 0)) {
        if (unaff_RBP == (char *)0x5) {
          iVar4 = strncmp("false",local_1c8,5);
          if (iVar4 != 0) goto LAB_01c600e3;
          duckdb_je_opt_hpa_opts.strict_min_purge_interval = false;
LAB_01c6085c:
          bVar21 = true;
        }
        else {
          if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("true",local_1c8,4), iVar4 == 0)) {
            duckdb_je_opt_hpa_opts.strict_min_purge_interval = true;
            goto LAB_01c6085c;
          }
LAB_01c600e3:
          malloc_conf_error("Invalid conf value",__s2,0x1d,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x1d;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0xe) && (iVar4 = strncmp("hpa_dirty_mult",__s2,0xe), iVar4 == 0)) {
        if ((unaff_RBP != (char *)0x2) || (iVar4 = strncmp("-1",local_1c8,2), iVar4 != 0)) {
          _Var3 = duckdb_je_fxp_parse((fxp_t *)local_1a8,local_1c8,local_168);
          if ((_Var3) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) {
            malloc_conf_error("Invalid conf value",__s2,0xe,local_1c8,(size_t)unaff_RBP);
            bVar21 = false;
          }
          else {
            duckdb_je_opt_hpa_opts.dirty_mult = (uint)local_1a8[0];
            bVar21 = true;
          }
          if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
          uVar20 = 0xe;
          goto LAB_01c5edf6;
        }
        duckdb_je_opt_hpa_opts.dirty_mult = 0xffffffff;
        if (duckdb_je_opt_confirm_conf != true) goto LAB_01c5ee03;
        uVar20 = 0xe;
        uVar12 = 2;
        goto LAB_01c5edf8;
      }
      if ((local_1b8 == (char *)0xf) && (iVar4 = strncmp("hpa_sec_nshards",__s2,0xf), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c601d8;
        bVar21 = true;
        duckdb_je_opt_hpa_sec_opts.nshards = uVar10;
        goto LAB_01c601f9;
      }
      if (local_1b8 == (char *)0x11) {
        iVar4 = strncmp("hpa_sec_max_alloc",__s2,0x11);
        if (iVar4 == 0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
            duckdb_je_opt_hpa_sec_opts.max_alloc = uVar10;
            if (uVar10 < 0x1000) {
              duckdb_je_opt_hpa_sec_opts.max_alloc = 0x1000;
            }
            bVar21 = true;
          }
          else {
            malloc_conf_error("Invalid conf value",__s2,0x11,local_1c8,(size_t)unaff_RBP);
            bVar21 = false;
          }
          if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
          uVar20 = 0x11;
          goto LAB_01c5edf6;
        }
        iVar4 = strncmp("hpa_sec_max_bytes",__s2,0x11);
        if (iVar4 != 0) goto LAB_01c5e36e;
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          duckdb_je_opt_hpa_sec_opts.max_bytes = uVar10;
          if (uVar10 < 0x1000) {
            duckdb_je_opt_hpa_sec_opts.max_bytes = 0x1000;
          }
          bVar21 = true;
        }
        else {
          malloc_conf_error("Invalid conf value",__s2,0x11,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar19 = 0x11;
LAB_01c609b9:
        duckdb_je_malloc_printf
                  ("<jemalloc>: -- Set conf value: %.*s:%.*s\n",uVar19,__s2,
                   (ulong)unaff_RBP & 0xffffffff,local_1c8);
        goto LAB_01c5ee03;
      }
LAB_01c5e36e:
      if ((local_1b8 == (char *)0x19) &&
         (iVar4 = strncmp("hpa_sec_bytes_after_flush",__s2,0x19), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar7 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c6043e;
        uVar10 = duckdb_je_opt_hpa_opts.min_purge_interval_ms;
        duckdb_je_opt_hpa_sec_opts.bytes_after_flush = uVar7;
        if (uVar7 < 0x1000) {
          duckdb_je_opt_hpa_sec_opts.bytes_after_flush = 0x1000;
        }
        goto LAB_01c6096f;
      }
      if ((local_1b8 == (char *)0x18) &&
         (iVar4 = strncmp("hpa_sec_batch_fill_extra",__s2,0x18), iVar4 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
        if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
          duckdb_je_opt_hpa_sec_opts.batch_fill_extra = uVar10;
          if (0x200 < uVar10) {
            duckdb_je_opt_hpa_sec_opts.batch_fill_extra = 0x200;
          }
          bVar21 = true;
        }
        else {
          malloc_conf_error("Invalid conf value",__s2,0x18,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar20 = 0x18;
        goto LAB_01c5edf6;
      }
      if ((local_1b8 == (char *)0xa) && (iVar4 = strncmp("slab_sizes",__s2,10), iVar4 == 0)) {
        if ((unaff_RBP == (char *)0x7) && (iVar4 = strncmp("default",local_1c8,7), iVar4 == 0)) {
          duckdb_je_sc_data_init(local_188);
          if (duckdb_je_opt_confirm_conf != true) goto LAB_01c5ee03;
          uVar20 = 10;
          goto LAB_01c5ee97;
        }
        bVar21 = true;
        local_1a8[0] = unaff_RBP;
        local_168[0] = local_1c8;
        do {
          _Var3 = duckdb_je_multi_setting_parse_next
                            (local_168,(size_t *)local_1a8,local_68,local_48,(size_t *)&local_190);
          if (_Var3) {
            malloc_conf_error("Invalid settings for slab_sizes",__s2,10,local_1c8,(size_t)unaff_RBP)
            ;
            bVar21 = false;
          }
          else {
            duckdb_je_sc_data_update_slab_size(local_188,local_68[0],local_48[0],local_190);
          }
        } while (!_Var3 && local_1a8[0] != (char *)0x0);
        if ((duckdb_je_opt_confirm_conf != true) || (!bVar21)) goto LAB_01c5ee03;
        uVar19 = 10;
        goto LAB_01c609b9;
      }
      if ((local_1b8 == (char *)0x3) && (iVar4 = strncmp("thp",__s2,3), iVar4 == 0)) {
        lVar17 = 0;
LAB_01c60637:
        iVar4 = strncmp(duckdb_je_thp_mode_names[lVar17],local_1c8,(size_t)unaff_RBP);
        if (iVar4 != 0) goto code_r0x01c60655;
        malloc_conf_error("No THP support",__s2,3,local_1c8,(size_t)unaff_RBP);
        ptVar8 = &duckdb_je_opt_thp;
LAB_01c5fb70:
        *ptVar8 = (thp_mode_t)lVar17;
        goto LAB_01c5ee03;
      }
      if ((local_1b8 != (char *)0xc) || (iVar4 = strncmp("zero_realloc",__s2,0xc), iVar4 != 0)) {
        if (local_1b8 != (char *)0xf) {
LAB_01c5e45c:
          pcVar11 = "Invalid conf pair";
          goto LAB_01c5f960;
        }
        iVar4 = strncmp("san_guard_small",__s2,0xf);
        if (iVar4 == 0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
            psVar15 = &duckdb_je_opt_san_guard_small;
            goto LAB_01c60956;
          }
LAB_01c6098e:
          malloc_conf_error("Invalid conf value",__s2,0xf,local_1c8,(size_t)unaff_RBP);
          bVar21 = false;
        }
        else {
          iVar4 = strncmp("san_guard_large",__s2,0xf);
          if (iVar4 != 0) goto LAB_01c5e45c;
          piVar9 = __errno_location();
          *piVar9 = 0;
          uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
          if ((*piVar9 != 0) || (local_168[0] + -(long)local_1c8 != unaff_RBP)) goto LAB_01c6098e;
          psVar15 = &duckdb_je_opt_san_guard_large;
LAB_01c60956:
          *psVar15 = uVar10;
          bVar21 = true;
        }
        if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
        uVar19 = 0xf;
        goto LAB_01c609b9;
      }
      if ((unaff_RBP == (char *)0x5) && (iVar4 = strncmp("alloc",local_1c8,5), iVar4 == 0)) {
        duckdb_je_opt_zero_realloc_action = zero_realloc_action_alloc;
        bVar21 = true;
      }
      else {
        if ((unaff_RBP == (char *)0x4) && (iVar4 = strncmp("free",local_1c8,4), iVar4 == 0)) {
          duckdb_je_opt_zero_realloc_action = zero_realloc_action_free;
        }
        else {
          if ((unaff_RBP != (char *)0x5) || (iVar4 = strncmp("abort",local_1c8,5), iVar4 != 0)) {
            malloc_conf_error("Invalid conf value",__s2,0xc,local_1c8,(size_t)unaff_RBP);
            bVar21 = false;
            goto LAB_01c60a1b;
          }
          duckdb_je_opt_zero_realloc_action = zero_realloc_action_abort;
        }
        bVar21 = true;
      }
LAB_01c60a1b:
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
      goto LAB_01c5e7bf;
    }
    if ((unaff_RBP != (char *)0x7) || (iVar4 = strncmp("default",local_1c8,7), iVar4 != 0)) {
      piVar9 = __errno_location();
      *piVar9 = 0;
      uVar10 = duckdb_je_malloc_strtoumax(local_1c8,local_168,0);
      if ((*piVar9 == 0) && (local_168[0] + -(long)local_1c8 == unaff_RBP)) {
        if (uVar10 == 0) {
          pcVar11 = "Out-of-range conf value";
          goto LAB_01c5eb69;
        }
        duckdb_je_opt_narenas = (uint)uVar10;
        bVar21 = true;
      }
      else {
        pcVar11 = "Invalid conf value";
LAB_01c5eb69:
        malloc_conf_error(pcVar11,__s2,7,local_1c8,(size_t)unaff_RBP);
        bVar21 = false;
      }
      if ((!bVar21) || (duckdb_je_opt_confirm_conf == false)) goto LAB_01c5ee03;
      uVar20 = 7;
      goto LAB_01c5edf6;
    }
    duckdb_je_opt_narenas = 0;
    if (duckdb_je_opt_confirm_conf != true) goto LAB_01c5ee03;
    uVar20 = 7;
LAB_01c5ee97:
    uVar12 = 7;
  }
LAB_01c5edf8:
  duckdb_je_malloc_printf("<jemalloc>: -- Set conf value: %.*s:%.*s\n",uVar20,__s2,uVar12,local_1c8)
  ;
LAB_01c5ee03:
  __s2 = pcVar16;
  if (*pcVar16 == '\0') goto LAB_01c60a4f;
  goto LAB_01c5db79;
code_r0x01c60655:
  lVar17 = lVar17 + 1;
  if (lVar17 == 3) goto LAB_01c5f951;
  goto LAB_01c60637;
}

Assistant:

static void
malloc_conf_init_helper(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    bool initial_call, const char *opts_cache[MALLOC_CONF_NSOURCES],
    char readlink_buf[PATH_MAX + 1]) {
	static const char *opts_explain[MALLOC_CONF_NSOURCES] = {
		"string specified via --with-malloc-conf",
		"string pointed to by the global variable malloc_conf",
		"\"name\" of the file referenced by the symbolic link named "
		    "/etc/malloc.conf",
		"value of the environment variable MALLOC_CONF",
		"string pointed to by the global variable "
		    "malloc_conf_2_conf_harder",
	};
	unsigned i;
	const char *opts, *k, *v;
	size_t klen, vlen;

	for (i = 0; i < MALLOC_CONF_NSOURCES; i++) {
		/* Get runtime configuration. */
		if (initial_call) {
			opts_cache[i] = obtain_malloc_conf(i, readlink_buf);
		}
		opts = opts_cache[i];
		if (!initial_call && opt_confirm_conf) {
			malloc_printf(
			    "<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",
			    i + 1, opts_explain[i], opts != NULL ? opts : "");
		}
		if (opts == NULL) {
			continue;
		}

		while (*opts != '\0' && !malloc_conf_next(&opts, &k, &klen, &v,
		    &vlen)) {

#define CONF_ERROR(msg, k, klen, v, vlen)				\
			if (!initial_call) {				\
				malloc_conf_error(			\
				    msg, k, klen, v, vlen);		\
				cur_opt_valid = false;			\
			}
#define CONF_CONTINUE	{						\
				if (!initial_call && opt_confirm_conf	\
				    && cur_opt_valid) {			\
					malloc_printf("<jemalloc>: -- "	\
					    "Set conf value: %.*s:%.*s"	\
					    "\n", (int)klen, k,		\
					    (int)vlen, v);		\
				}					\
				continue;				\
			}
#define CONF_MATCH(n)							\
	(sizeof(n)-1 == klen && strncmp(n, k, klen) == 0)
#define CONF_MATCH_VALUE(n)						\
	(sizeof(n)-1 == vlen && strncmp(n, v, vlen) == 0)
#define CONF_HANDLE_BOOL(o, n)						\
			if (CONF_MATCH(n)) {				\
				if (CONF_MATCH_VALUE("true")) {		\
					o = true;			\
				} else if (CONF_MATCH_VALUE("false")) {	\
					o = false;			\
				} else {				\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				}					\
				CONF_CONTINUE;				\
			}
      /*
       * One of the CONF_MIN macros below expands, in one of the use points,
       * to "unsigned integer < 0", which is always false, triggering the
       * GCC -Wtype-limits warning, which we disable here and re-enable below.
       */
      JEMALLOC_DIAGNOSTIC_PUSH
      JEMALLOC_DIAGNOSTIC_IGNORE_TYPE_LIMITS

#define CONF_DONT_CHECK_MIN(um, min)	false
#define CONF_CHECK_MIN(um, min)	((um) < (min))
#define CONF_DONT_CHECK_MAX(um, max)	false
#define CONF_CHECK_MAX(um, max)	((um) > (max))

#define CONF_VALUE_READ(max_t, result)					\
	      char *end;						\
	      set_errno(0);						\
	      result = (max_t)malloc_strtoumax(v, &end, 0);
#define CONF_VALUE_READ_FAIL()						\
	      (get_errno() != 0 || (uintptr_t)end - (uintptr_t)v != vlen)

#define CONF_HANDLE_T(t, max_t, o, n, min, max, check_min, check_max, clip) \
			if (CONF_MATCH(n)) {				\
				max_t mv;				\
				CONF_VALUE_READ(max_t, mv)		\
				if (CONF_VALUE_READ_FAIL()) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (clip) {			\
					if (check_min(mv, (t)(min))) {	\
						o = (t)(min);		\
					} else if (			\
					    check_max(mv, (t)(max))) {	\
						o = (t)(max);		\
					} else {			\
						o = (t)mv;		\
					}				\
				} else {				\
					if (check_min(mv, (t)(min)) ||	\
					    check_max(mv, (t)(max))) {	\
						CONF_ERROR(		\
						    "Out-of-range "	\
						    "conf value",	\
						    k, klen, v, vlen);	\
					} else {			\
						o = (t)mv;		\
					}				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_T_U(t, o, n, min, max, check_min, check_max, clip)	\
	      CONF_HANDLE_T(t, uintmax_t, o, n, min, max, check_min,	\
			    check_max, clip)
#define CONF_HANDLE_T_SIGNED(t, o, n, min, max, check_min, check_max, clip)\
	      CONF_HANDLE_T(t, intmax_t, o, n, min, max, check_min,	\
			    check_max, clip)

#define CONF_HANDLE_UNSIGNED(o, n, min, max, check_min, check_max,	\
    clip)								\
			CONF_HANDLE_T_U(unsigned, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_SIZE_T(o, n, min, max, check_min, check_max, clip)	\
			CONF_HANDLE_T_U(size_t, o, n, min, max,		\
			    check_min, check_max, clip)
#define CONF_HANDLE_INT64_T(o, n, min, max, check_min, check_max, clip)	\
			CONF_HANDLE_T_SIGNED(int64_t, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_UINT64_T(o, n, min, max, check_min, check_max, clip)\
			CONF_HANDLE_T_U(uint64_t, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_SSIZE_T(o, n, min, max)				\
			CONF_HANDLE_T_SIGNED(ssize_t, o, n, min, max,	\
			    CONF_CHECK_MIN, CONF_CHECK_MAX, false)
#define CONF_HANDLE_CHAR_P(o, n, d)					\
			if (CONF_MATCH(n)) {				\
				size_t cpylen = (vlen <=		\
				    sizeof(o)-1) ? vlen :		\
				    sizeof(o)-1;			\
				strncpy(o, v, cpylen);			\
				o[cpylen] = '\0';			\
				CONF_CONTINUE;				\
			}

			bool cur_opt_valid = true;

			CONF_HANDLE_BOOL(opt_confirm_conf, "confirm_conf")
			if (initial_call) {
				continue;
			}

			CONF_HANDLE_BOOL(opt_abort, "abort")
			CONF_HANDLE_BOOL(opt_abort_conf, "abort_conf")
			CONF_HANDLE_BOOL(opt_cache_oblivious, "cache_oblivious")
			CONF_HANDLE_BOOL(opt_trust_madvise, "trust_madvise")
			if (strncmp("metadata_thp", k, klen) == 0) {
				int m;
				bool match = false;
				for (m = 0; m < metadata_thp_mode_limit; m++) {
					if (strncmp(metadata_thp_mode_names[m],
					    v, vlen) == 0) {
						opt_metadata_thp = m;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_retain, "retain")
			if (strncmp("dss", k, klen) == 0) {
				int m;
				bool match = false;
				for (m = 0; m < dss_prec_limit; m++) {
					if (strncmp(dss_prec_names[m], v, vlen)
					    == 0) {
						if (extent_dss_prec_set(m)) {
							CONF_ERROR(
							    "Error setting dss",
							    k, klen, v, vlen);
						} else {
							opt_dss =
							    dss_prec_names[m];
							match = true;
							break;
						}
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			if (CONF_MATCH("narenas")) {
				if (CONF_MATCH_VALUE("default")) {
					opt_narenas = 0;
					CONF_CONTINUE;
				} else {
					CONF_HANDLE_UNSIGNED(opt_narenas,
					    "narenas", 1, UINT_MAX,
					    CONF_CHECK_MIN, CONF_DONT_CHECK_MAX,
					    /* clip */ false)
				}
			}
			if (CONF_MATCH("narenas_ratio")) {
				char *end;
				bool err = fxp_parse(&opt_narenas_ratio, v,
				    &end);
				if (err || (size_t)(end - v) != vlen) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			if (CONF_MATCH("bin_shards")) {
				const char *bin_shards_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t size_start;
					size_t size_end;
					size_t nshards;
					bool err = multi_setting_parse_next(
					    &bin_shards_segment_cur, &vlen_left,
					    &size_start, &size_end, &nshards);
					if (err || bin_update_shard_size(
					    bin_shard_sizes, size_start,
					    size_end, nshards)) {
						CONF_ERROR(
						    "Invalid settings for "
						    "bin_shards", k, klen, v,
						    vlen);
						break;
					}
				} while (vlen_left > 0);
				CONF_CONTINUE;
			}
			CONF_HANDLE_SIZE_T(opt_bin_info_max_batched_size,
			    "max_batched_size", 0, SIZE_T_MAX,
			    CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    /* clip */ true)
			CONF_HANDLE_SIZE_T(opt_bin_info_remote_free_max_batch,
			    "remote_free_max_batch", 0,
			    BIN_REMOTE_FREE_ELEMS_MAX,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
			    /* clip */ true)
			CONF_HANDLE_SIZE_T(opt_bin_info_remote_free_max,
			    "remote_free_max", 0,
			    BIN_REMOTE_FREE_ELEMS_MAX,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
			    /* clip */ true)

			if (CONF_MATCH("tcache_ncached_max")) {
				bool err = tcache_bin_info_default_init(
				    v, vlen);
				if (err) {
					CONF_ERROR("Invalid settings for "
					    "tcache_ncached_max", k, klen, v,
					    vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_INT64_T(opt_mutex_max_spin,
			    "mutex_max_spin", -1, INT64_MAX, CONF_CHECK_MIN,
			    CONF_DONT_CHECK_MAX, false);
			CONF_HANDLE_SSIZE_T(opt_dirty_decay_ms,
			    "dirty_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_SSIZE_T(opt_muzzy_decay_ms,
			    "muzzy_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_BOOL(opt_stats_print, "stats_print")
			if (CONF_MATCH("stats_print_opts")) {
				init_opt_stats_opts(v, vlen,
				    opt_stats_print_opts);
				CONF_CONTINUE;
			}
			CONF_HANDLE_INT64_T(opt_stats_interval,
			    "stats_interval", -1, INT64_MAX,
			    CONF_CHECK_MIN, CONF_DONT_CHECK_MAX, false)
			if (CONF_MATCH("stats_interval_opts")) {
				init_opt_stats_opts(v, vlen,
				    opt_stats_interval_opts);
				CONF_CONTINUE;
			}
			if (config_fill) {
				if (CONF_MATCH("junk")) {
					if (CONF_MATCH_VALUE("true")) {
						opt_junk = "true";
						opt_junk_alloc = opt_junk_free =
						    true;
					} else if (CONF_MATCH_VALUE("false")) {
						opt_junk = "false";
						opt_junk_alloc = opt_junk_free =
						    false;
					} else if (CONF_MATCH_VALUE("alloc")) {
						opt_junk = "alloc";
						opt_junk_alloc = true;
						opt_junk_free = false;
					} else if (CONF_MATCH_VALUE("free")) {
						opt_junk = "free";
						opt_junk_alloc = false;
						opt_junk_free = true;
					} else {
						CONF_ERROR(
						    "Invalid conf value",
						    k, klen, v, vlen);
					}
					CONF_CONTINUE;
				}
				CONF_HANDLE_BOOL(opt_zero, "zero")
			}
			if (config_utrace) {
				CONF_HANDLE_BOOL(opt_utrace, "utrace")
			}
			if (config_xmalloc) {
				CONF_HANDLE_BOOL(opt_xmalloc, "xmalloc")
			}
			if (config_enable_cxx) {
				CONF_HANDLE_BOOL(
				    opt_experimental_infallible_new,
				    "experimental_infallible_new")
			}

			CONF_HANDLE_BOOL(opt_tcache, "tcache")
			CONF_HANDLE_SIZE_T(opt_tcache_max, "tcache_max",
			    0, TCACHE_MAXCLASS_LIMIT, CONF_DONT_CHECK_MIN,
			    CONF_CHECK_MAX, /* clip */ true)
			if (CONF_MATCH("lg_tcache_max")) {
				size_t m;
				CONF_VALUE_READ(size_t, m)
				if (CONF_VALUE_READ_FAIL()) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				} else {
					/* clip if necessary */
					if (m > TCACHE_LG_MAXCLASS_LIMIT) {
						m = TCACHE_LG_MAXCLASS_LIMIT;
					}
					opt_tcache_max = (size_t)1 << m;
				}
				CONF_CONTINUE;
			}
			/*
			 * Anyone trying to set a value outside -16 to 16 is
			 * deeply confused.
			 */
			CONF_HANDLE_SSIZE_T(opt_lg_tcache_nslots_mul,
			    "lg_tcache_nslots_mul", -16, 16)
			/* Ditto with values past 2048. */
			CONF_HANDLE_UNSIGNED(opt_tcache_nslots_small_min,
			    "tcache_nslots_small_min", 1, 2048,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, /* clip */ true)
			CONF_HANDLE_UNSIGNED(opt_tcache_nslots_small_max,
			    "tcache_nslots_small_max", 1, 2048,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, /* clip */ true)
			CONF_HANDLE_UNSIGNED(opt_tcache_nslots_large,
			    "tcache_nslots_large", 1, 2048,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, /* clip */ true)
			CONF_HANDLE_SIZE_T(opt_tcache_gc_incr_bytes,
			    "tcache_gc_incr_bytes", 1024, SIZE_T_MAX,
			    CONF_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    /* clip */ true)
			CONF_HANDLE_SIZE_T(opt_tcache_gc_delay_bytes,
			    "tcache_gc_delay_bytes", 0, SIZE_T_MAX,
			    CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    /* clip */ false)
			CONF_HANDLE_UNSIGNED(opt_lg_tcache_flush_small_div,
			    "lg_tcache_flush_small_div", 1, 16,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, /* clip */ true)
			CONF_HANDLE_UNSIGNED(opt_lg_tcache_flush_large_div,
			    "lg_tcache_flush_large_div", 1, 16,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, /* clip */ true)
			CONF_HANDLE_UNSIGNED(opt_debug_double_free_max_scan,
			    "debug_double_free_max_scan", 0, UINT_MAX,
			    CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    /* clip */ false)
			CONF_HANDLE_SIZE_T(opt_calloc_madvise_threshold,
			    "calloc_madvise_threshold", 0, SC_LARGE_MAXCLASS,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX, /* clip */ false)

			/*
			 * The runtime option of oversize_threshold remains
			 * undocumented.  It may be tweaked in the next major
			 * release (6.0).  The default value 8M is rather
			 * conservative / safe.  Tuning it further down may
			 * improve fragmentation a bit more, but may also cause
			 * contention on the huge arena.
			 */
			CONF_HANDLE_SIZE_T(opt_oversize_threshold,
			    "oversize_threshold", 0, SC_LARGE_MAXCLASS,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX, false)
			CONF_HANDLE_SIZE_T(opt_lg_extent_max_active_fit,
			    "lg_extent_max_active_fit", 0,
			    (sizeof(size_t) << 3), CONF_DONT_CHECK_MIN,
			    CONF_CHECK_MAX, false)

			if (strncmp("percpu_arena", k, klen) == 0) {
				bool match = false;
				for (int m = percpu_arena_mode_names_base; m <
				    percpu_arena_mode_names_limit; m++) {
					if (strncmp(percpu_arena_mode_names[m],
					    v, vlen) == 0) {
						if (!have_percpu_arena) {
							CONF_ERROR(
							    "No getcpu support",
							    k, klen, v, vlen);
						}
						opt_percpu_arena = m;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_background_thread,
			    "background_thread");
			CONF_HANDLE_SIZE_T(opt_max_background_threads,
					   "max_background_threads", 1,
					   opt_max_background_threads,
					   CONF_CHECK_MIN, CONF_CHECK_MAX,
					   true);
			CONF_HANDLE_BOOL(opt_hpa, "hpa")
			CONF_HANDLE_SIZE_T(opt_hpa_opts.slab_max_alloc,
			    "hpa_slab_max_alloc", PAGE, HUGEPAGE,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, true);

			/*
			 * Accept either a ratio-based or an exact hugification
			 * threshold.
			 */
			CONF_HANDLE_SIZE_T(opt_hpa_opts.hugification_threshold,
			    "hpa_hugification_threshold", PAGE, HUGEPAGE,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, true);
			if (CONF_MATCH("hpa_hugification_threshold_ratio")) {
				fxp_t ratio;
				char *end;
				bool err = fxp_parse(&ratio, v,
				    &end);
				if (err || (size_t)(end - v) != vlen
				    || ratio > FXP_INIT_INT(1)) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				} else {
					opt_hpa_opts.hugification_threshold =
					    fxp_mul_frac(HUGEPAGE, ratio);
				}
				CONF_CONTINUE;
			}

			CONF_HANDLE_UINT64_T(
			    opt_hpa_opts.hugify_delay_ms, "hpa_hugify_delay_ms",
			    0, 0, CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    false);

			CONF_HANDLE_UINT64_T(
			    opt_hpa_opts.min_purge_interval_ms,
			    "hpa_min_purge_interval_ms", 0, 0,
			    CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX, false);

			CONF_HANDLE_BOOL(
			    opt_hpa_opts.strict_min_purge_interval,
			    "hpa_strict_min_purge_interval");

			if (CONF_MATCH("hpa_dirty_mult")) {
				if (CONF_MATCH_VALUE("-1")) {
					opt_hpa_opts.dirty_mult = (fxp_t)-1;
					CONF_CONTINUE;
				}
				fxp_t ratio;
				char *end;
				bool err = fxp_parse(&ratio, v,
				    &end);
				if (err || (size_t)(end - v) != vlen) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				} else {
					opt_hpa_opts.dirty_mult = ratio;
				}
				CONF_CONTINUE;
			}

			CONF_HANDLE_SIZE_T(opt_hpa_sec_opts.nshards,
			    "hpa_sec_nshards", 0, 0, CONF_CHECK_MIN,
			    CONF_DONT_CHECK_MAX, true);
			CONF_HANDLE_SIZE_T(opt_hpa_sec_opts.max_alloc,
			    "hpa_sec_max_alloc", PAGE, 0, CONF_CHECK_MIN,
			    CONF_DONT_CHECK_MAX, true);
			CONF_HANDLE_SIZE_T(opt_hpa_sec_opts.max_bytes,
			    "hpa_sec_max_bytes", PAGE, 0, CONF_CHECK_MIN,
			    CONF_DONT_CHECK_MAX, true);
			CONF_HANDLE_SIZE_T(opt_hpa_sec_opts.bytes_after_flush,
			    "hpa_sec_bytes_after_flush", PAGE, 0,
			    CONF_CHECK_MIN, CONF_DONT_CHECK_MAX, true);
			CONF_HANDLE_SIZE_T(opt_hpa_sec_opts.batch_fill_extra,
			    "hpa_sec_batch_fill_extra", 0, HUGEPAGE_PAGES,
			    CONF_CHECK_MIN, CONF_CHECK_MAX, true);

			if (CONF_MATCH("slab_sizes")) {
				if (CONF_MATCH_VALUE("default")) {
					sc_data_init(sc_data);
					CONF_CONTINUE;
				}
				bool err;
				const char *slab_size_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t slab_start;
					size_t slab_end;
					size_t pgs;
					err = multi_setting_parse_next(
					    &slab_size_segment_cur,
					    &vlen_left, &slab_start, &slab_end,
					    &pgs);
					if (!err) {
						sc_data_update_slab_size(
						    sc_data, slab_start,
						    slab_end, (int)pgs);
					} else {
						CONF_ERROR("Invalid settings "
						    "for slab_sizes",
						    k, klen, v, vlen);
					}
				} while (!err && vlen_left > 0);
				CONF_CONTINUE;
			}
			if (config_prof) {
				CONF_HANDLE_BOOL(opt_prof, "prof")
				CONF_HANDLE_CHAR_P(opt_prof_prefix,
				    "prof_prefix", "jeprof")
				CONF_HANDLE_BOOL(opt_prof_active, "prof_active")
				CONF_HANDLE_BOOL(opt_prof_thread_active_init,
				    "prof_thread_active_init")
				CONF_HANDLE_SIZE_T(opt_lg_prof_sample,
				    "lg_prof_sample", 0, (sizeof(uint64_t) << 3)
				    - 1, CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
				    true)
				CONF_HANDLE_BOOL(opt_prof_accum, "prof_accum")
				CONF_HANDLE_UNSIGNED(opt_prof_bt_max, "prof_bt_max",
				    1, PROF_BT_MAX_LIMIT, CONF_CHECK_MIN, CONF_CHECK_MAX,
				    /* clip */ true)
				CONF_HANDLE_SSIZE_T(opt_lg_prof_interval,
				    "lg_prof_interval", -1,
				    (sizeof(uint64_t) << 3) - 1)
				CONF_HANDLE_BOOL(opt_prof_gdump, "prof_gdump")
				CONF_HANDLE_BOOL(opt_prof_final, "prof_final")
				CONF_HANDLE_BOOL(opt_prof_leak, "prof_leak")
				CONF_HANDLE_BOOL(opt_prof_leak_error,
				    "prof_leak_error")
				CONF_HANDLE_BOOL(opt_prof_log, "prof_log")
				CONF_HANDLE_BOOL(opt_prof_pid_namespace, "prof_pid_namespace")
				CONF_HANDLE_SSIZE_T(opt_prof_recent_alloc_max,
				    "prof_recent_alloc_max", -1, SSIZE_MAX)
				CONF_HANDLE_BOOL(opt_prof_stats, "prof_stats")
				CONF_HANDLE_BOOL(opt_prof_sys_thread_name,
				    "prof_sys_thread_name")
				if (CONF_MATCH("prof_time_resolution")) {
					if (CONF_MATCH_VALUE("default")) {
						opt_prof_time_res =
						    prof_time_res_default;
					} else if (CONF_MATCH_VALUE("high")) {
						if (!config_high_res_timer) {
							CONF_ERROR(
							    "No high resolution"
							    " timer support",
							    k, klen, v, vlen);
						} else {
							opt_prof_time_res =
							    prof_time_res_high;
						}
					} else {
						CONF_ERROR("Invalid conf value",
						    k, klen, v, vlen);
					}
					CONF_CONTINUE;
				}
				/*
				 * Undocumented.  When set to false, don't
				 * correct for an unbiasing bug in jeprof
				 * attribution.  This can be handy if you want
				 * to get consistent numbers from your binary
				 * across different jemalloc versions, even if
				 * those numbers are incorrect.  The default is
				 * true.
				 */
				CONF_HANDLE_BOOL(opt_prof_unbias, "prof_unbias")
			}
			if (config_log) {
				if (CONF_MATCH("log")) {
					size_t cpylen = (
					    vlen <= sizeof(log_var_names) ?
					    vlen : sizeof(log_var_names) - 1);
					strncpy(log_var_names, v, cpylen);
					log_var_names[cpylen] = '\0';
					CONF_CONTINUE;
				}
			}
			if (CONF_MATCH("thp")) {
				bool match = false;
				for (int m = 0; m < thp_mode_names_limit; m++) {
					if (strncmp(thp_mode_names[m],v, vlen)
					    == 0) {
						if (!have_madvise_huge && !have_memcntl) {
							CONF_ERROR(
							    "No THP support",
							    k, klen, v, vlen);
						}
						opt_thp = m;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			if (CONF_MATCH("zero_realloc")) {
				if (CONF_MATCH_VALUE("alloc")) {
					opt_zero_realloc_action
					    = zero_realloc_action_alloc;
				} else if (CONF_MATCH_VALUE("free")) {
					opt_zero_realloc_action
					    = zero_realloc_action_free;
				} else if (CONF_MATCH_VALUE("abort")) {
					opt_zero_realloc_action
					    = zero_realloc_action_abort;
				} else {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			if (config_uaf_detection &&
			    CONF_MATCH("lg_san_uaf_align")) {
				ssize_t a;
				CONF_VALUE_READ(ssize_t, a)
				if (CONF_VALUE_READ_FAIL() || a < -1) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				if (a == -1) {
					opt_lg_san_uaf_align = -1;
					CONF_CONTINUE;
				}

				/* clip if necessary */
				ssize_t max_allowed = (sizeof(size_t) << 3) - 1;
				ssize_t min_allowed = LG_PAGE;
				if (a > max_allowed) {
					a = max_allowed;
				} else if (a < min_allowed) {
					a = min_allowed;
				}

				opt_lg_san_uaf_align = a;
				CONF_CONTINUE;
			}

			CONF_HANDLE_SIZE_T(opt_san_guard_small,
			    "san_guard_small", 0, SIZE_T_MAX,
			    CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX, false)
			CONF_HANDLE_SIZE_T(opt_san_guard_large,
			    "san_guard_large", 0, SIZE_T_MAX,
			    CONF_DONT_CHECK_MIN, CONF_DONT_CHECK_MAX, false)

			CONF_ERROR("Invalid conf pair", k, klen, v, vlen);
#undef CONF_ERROR
#undef CONF_CONTINUE
#undef CONF_MATCH
#undef CONF_MATCH_VALUE
#undef CONF_HANDLE_BOOL
#undef CONF_DONT_CHECK_MIN
#undef CONF_CHECK_MIN
#undef CONF_DONT_CHECK_MAX
#undef CONF_CHECK_MAX
#undef CONF_HANDLE_T
#undef CONF_HANDLE_T_U
#undef CONF_HANDLE_T_SIGNED
#undef CONF_HANDLE_UNSIGNED
#undef CONF_HANDLE_SIZE_T
#undef CONF_HANDLE_SSIZE_T
#undef CONF_HANDLE_CHAR_P
    /* Re-enable diagnostic "-Wtype-limits" */
    JEMALLOC_DIAGNOSTIC_POP
		}
		validate_hpa_settings();
		if (opt_abort_conf && had_conf_error) {
			malloc_abort_invalid_conf();
		}
	}
	atomic_store_b(&log_init_done, true, ATOMIC_RELEASE);
}

static bool
malloc_conf_init_check_deps(void) {
	if (opt_prof_leak_error && !opt_prof_final) {
		malloc_printf("<jemalloc>: prof_leak_error is set w/o "
		    "prof_final.\n");
		return true;
	}
	/* To emphasize in the stats output that opt is disabled when !debug. */
	if (!config_debug) {
		opt_debug_double_free_max_scan = 0;
	}

	return false;
}

static void
malloc_conf_init(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    char readlink_buf[PATH_MAX + 1]) {
	const char *opts_cache[MALLOC_CONF_NSOURCES] = {NULL, NULL, NULL, NULL,
		NULL};

	/* The first call only set the confirm_conf option and opts_cache */
	malloc_conf_init_helper(NULL, NULL, true, opts_cache, readlink_buf);
	malloc_conf_init_helper(sc_data, bin_shard_sizes, false, opts_cache,
	    NULL);
	if (malloc_conf_init_check_deps()) {
		/* check_deps does warning msg only; abort below if needed. */
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		}
	}
}

#undef MALLOC_CONF_NSOURCES

static bool
malloc_init_hard_needed(void) {
	if (malloc_initialized() || (IS_INITIALIZER && malloc_init_state ==
	    malloc_init_recursible)) {
		/*
		 * Another thread initialized the allocator before this one
		 * acquired init_lock, or this thread is the initializing
		 * thread, and it is recursively allocating.
		 */
		return false;
	}
#ifdef JEMALLOC_THREADED_INIT
	if (malloc_initializer != NO_INITIALIZER && !IS_INITIALIZER) {
		/* Busy-wait until the initializing thread completes. */
		spin_t spinner = SPIN_INITIALIZER;
		do {
			malloc_mutex_unlock(TSDN_NULL, &init_lock);
			spin_adaptive(&spinner);
			malloc_mutex_lock(TSDN_NULL, &init_lock);
		} while (!malloc_initialized());
		return false;
	}
#endif
	return true;
}

static bool
malloc_init_hard_a0_locked(void) {
	malloc_initializer = INITIALIZER;

	JEMALLOC_DIAGNOSTIC_PUSH
	JEMALLOC_DIAGNOSTIC_IGNORE_MISSING_STRUCT_FIELD_INITIALIZERS
	sc_data_t sc_data = {0};
	JEMALLOC_DIAGNOSTIC_POP

	/*
	 * Ordering here is somewhat tricky; we need sc_boot() first, since that
	 * determines what the size classes will be, and then
	 * malloc_conf_init(), since any slab size tweaking will need to be done
	 * before sz_boot and bin_info_boot, which assume that the values they
	 * read out of sc_data_global are final.
	 */
	sc_boot(&sc_data);
	unsigned bin_shard_sizes[SC_NBINS];
	bin_shard_sizes_boot(bin_shard_sizes);
	/*
	 * prof_boot0 only initializes opt_prof_prefix.  We need to do it before
	 * we parse malloc_conf options, in case malloc_conf parsing overwrites
	 * it.
	 */
	if (config_prof) {
		prof_boot0();
	}
	char readlink_buf[PATH_MAX + 1];
	readlink_buf[0] = '\0';
	malloc_conf_init(&sc_data, bin_shard_sizes, readlink_buf);
	san_init(opt_lg_san_uaf_align);
	sz_boot(&sc_data, opt_cache_oblivious);
	bin_info_boot(&sc_data, bin_shard_sizes);

	if (opt_stats_print) {
		/* Print statistics at exit. */
		if (atexit(stats_print_atexit) != 0) {
			malloc_write("<jemalloc>: Error in atexit()\n");
			if (opt_abort) {
				abort();
			}
		}
	}

	if (stats_boot()) {
		return true;
	}
	if (pages_boot()) {
		return true;
	}
	if (base_boot(TSDN_NULL)) {
		return true;
	}
	/* emap_global is static, hence zeroed. */
	if (emap_init(&arena_emap_global, b0get(), /* zeroed */ true)) {
		return true;
	}
	if (extent_boot()) {
		return true;
	}
	if (ctl_boot()) {
		return true;
	}
	if (config_prof) {
		prof_boot1();
	}
	if (opt_hpa && !hpa_supported()) {
		malloc_printf("<jemalloc>: HPA not supported in the current "
		    "configuration; %s.",
		    opt_abort_conf ? "aborting" : "disabling");
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		} else {
			opt_hpa = false;
		}
	}
	if (arena_boot(&sc_data, b0get(), opt_hpa)) {
		return true;
	}
	if (tcache_boot(TSDN_NULL, b0get())) {
		return true;
	}
	if (malloc_mutex_init(&arenas_lock, "arenas", WITNESS_RANK_ARENAS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	hook_boot();
	/*
	 * Create enough scaffolding to allow recursive allocation in
	 * malloc_ncpus().
	 */
	narenas_auto = 1;
	manual_arena_base = narenas_auto + 1;
	memset(arenas, 0, sizeof(arena_t *) * narenas_auto);
	/*
	 * Initialize one arena here.  The rest are lazily created in
	 * arena_choose_hard().
	 */
	if (arena_init(TSDN_NULL, 0, &arena_config_default) == NULL) {
		return true;
	}
	a0 = arena_get(TSDN_NULL, 0, false);

	if (opt_hpa && !hpa_supported()) {
		malloc_printf("<jemalloc>: HPA not supported in the current "
		    "configuration; %s.",
		    opt_abort_conf ? "aborting" : "disabling");
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		} else {
			opt_hpa = false;
		}
	} else if (opt_hpa) {
		hpa_shard_opts_t hpa_shard_opts = opt_hpa_opts;
		hpa_shard_opts.deferral_allowed = background_thread_enabled();
		if (pa_shard_enable_hpa(TSDN_NULL, &a0->pa_shard,
		    &hpa_shard_opts, &opt_hpa_sec_opts)) {
			return true;
		}
	}

	malloc_init_state = malloc_init_a0_initialized;

	size_t buf_len = strlen(readlink_buf);
	if (buf_len > 0) {
		void *readlink_allocated = a0ialloc(buf_len + 1, false, true);
		if (readlink_allocated != NULL) {
			memcpy(readlink_allocated, readlink_buf, buf_len + 1);
			opt_malloc_conf_symlink = readlink_allocated;
		}
	}

	return false;
}

static bool
malloc_init_hard_a0(void) {
	bool ret;

	malloc_mutex_lock(TSDN_NULL, &init_lock);
	ret = malloc_init_hard_a0_locked();
	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	return ret;
}

/* Initialize data structures which may trigger recursive allocation. */
static bool
malloc_init_hard_recursible(void) {
	malloc_init_state = malloc_init_recursible;

	ncpus = malloc_ncpus();
	if (opt_percpu_arena != percpu_arena_disabled) {
		bool cpu_count_is_deterministic =
		    malloc_cpu_count_is_deterministic();
		if (!cpu_count_is_deterministic) {
			/*
			 * If # of CPU is not deterministic, and narenas not
			 * specified, disables per cpu arena since it may not
			 * detect CPU IDs properly.
			 */
			if (opt_narenas == 0) {
				opt_percpu_arena = percpu_arena_disabled;
				malloc_write("<jemalloc>: Number of CPUs "
				    "detected is not deterministic. Per-CPU "
				    "arena disabled.\n");
				if (opt_abort_conf) {
					malloc_abort_invalid_conf();
				}
				if (opt_abort) {
					abort();
				}
			}
		}
	}

#if (defined(JEMALLOC_HAVE_PTHREAD_ATFORK) && !defined(JEMALLOC_MUTEX_INIT_CB) \
    && !defined(JEMALLOC_ZONE) && !defined(_WIN32) && \
    !defined(__native_client__))
	/* LinuxThreads' pthread_atfork() allocates. */
	if (pthread_atfork(jemalloc_prefork, jemalloc_postfork_parent,
	    jemalloc_postfork_child) != 0) {
		malloc_write("<jemalloc>: Error in pthread_atfork()\n");
		if (opt_abort) {
			abort();
		}
		return true;
	}
#endif

	if (background_thread_boot0()) {
		return true;
	}

	return false;
}

static unsigned
malloc_narenas_default(void) {
	assert(ncpus > 0);
	/*
	 * For SMP systems, create more than one arena per CPU by
	 * default.
	 */
	if (ncpus > 1) {
		fxp_t fxp_ncpus = FXP_INIT_INT(ncpus);
		fxp_t goal = fxp_mul(fxp_ncpus, opt_narenas_ratio);
		uint32_t int_goal = fxp_round_nearest(goal);
		if (int_goal == 0) {
			return 1;
		}
		return int_goal;
	} else {
		return 1;
	}
}

static percpu_arena_mode_t
percpu_arena_as_initialized(percpu_arena_mode_t mode) {
	assert(!malloc_initialized());
	assert(mode <= percpu_arena_disabled);

	if (mode != percpu_arena_disabled) {
		mode += percpu_arena_mode_enabled_base;
	}

	return mode;
}

static bool
malloc_init_narenas(void) {
	assert(ncpus > 0);

	if (opt_percpu_arena != percpu_arena_disabled) {
		if (!have_percpu_arena || malloc_getcpu() < 0) {
			opt_percpu_arena = percpu_arena_disabled;
			malloc_printf("<jemalloc>: perCPU arena getcpu() not "
			    "available. Setting narenas to %u.\n", opt_narenas ?
			    opt_narenas : malloc_narenas_default());
			if (opt_abort) {
				abort();
			}
		} else {
			if (ncpus >= MALLOCX_ARENA_LIMIT) {
				malloc_printf("<jemalloc>: narenas w/ percpu"
				    "arena beyond limit (%d)\n", ncpus);
				if (opt_abort) {
					abort();
				}
				return true;
			}
			/* NB: opt_percpu_arena isn't fully initialized yet. */
			if (percpu_arena_as_initialized(opt_percpu_arena) ==
			    per_phycpu_arena && ncpus % 2 != 0) {
				malloc_printf("<jemalloc>: invalid "
				    "configuration -- per physical CPU arena "
				    "with odd number (%u) of CPUs (no hyper "
				    "threading?).\n", ncpus);
				if (opt_abort)
					abort();
			}
			unsigned n = percpu_arena_ind_limit(
			    percpu_arena_as_initialized(opt_percpu_arena));
			if (opt_narenas < n) {
				/*
				 * If narenas is specified with percpu_arena
				 * enabled, actual narenas is set as the greater
				 * of the two. percpu_arena_choose will be free
				 * to use any of the arenas based on CPU
				 * id. This is conservative (at a small cost)
				 * but ensures correctness.
				 *
				 * If for some reason the ncpus determined at
				 * boot is not the actual number (e.g. because
				 * of affinity setting from numactl), reserving
				 * narenas this way provides a workaround for
				 * percpu_arena.
				 */
				opt_narenas = n;
			}
		}
	}
	if (opt_narenas == 0) {
		opt_narenas = malloc_narenas_default();
	}
	assert(opt_narenas > 0);

	narenas_auto = opt_narenas;
	/*
	 * Limit the number of arenas to the indexing range of MALLOCX_ARENA().
	 */
	if (narenas_auto >= MALLOCX_ARENA_LIMIT) {
		narenas_auto = MALLOCX_ARENA_LIMIT - 1;
		malloc_printf("<jemalloc>: Reducing narenas to limit (%d)\n",
		    narenas_auto);
	}
	narenas_total_set(narenas_auto);
	if (arena_init_huge(a0)) {
		narenas_total_inc();
	}
	manual_arena_base = narenas_total_get();

	return false;
}

static void
malloc_init_percpu(void) {
	opt_percpu_arena = percpu_arena_as_initialized(opt_percpu_arena);
}

static bool
malloc_init_hard_finish(void) {
	if (malloc_mutex_boot()) {
		return true;
	}

	malloc_init_state = malloc_init_initialized;
	malloc_slow_flag_init();

	return false;
}

static void
malloc_init_hard_cleanup(tsdn_t *tsdn, bool reentrancy_set) {
	malloc_mutex_assert_owner(tsdn, &init_lock);
	malloc_mutex_unlock(tsdn, &init_lock);
	if (reentrancy_set) {
		assert(!tsdn_null(tsdn));
		tsd_t *tsd = tsdn_tsd(tsdn);
		assert(tsd_reentrancy_level_get(tsd) > 0);
		post_reentrancy(tsd);
	}
}

static bool
malloc_init_hard(void) {
	tsd_t *tsd;

#if defined(_WIN32) && _WIN32_WINNT < 0x0600
	_init_init_lock();
#endif
	malloc_mutex_lock(TSDN_NULL, &init_lock);

#define UNLOCK_RETURN(tsdn, ret, reentrancy)		\
	malloc_init_hard_cleanup(tsdn, reentrancy);	\
	return ret;

	if (!malloc_init_hard_needed()) {
		UNLOCK_RETURN(TSDN_NULL, false, false)
	}

	if (malloc_init_state != malloc_init_a0_initialized &&
	    malloc_init_hard_a0_locked()) {
		UNLOCK_RETURN(TSDN_NULL, true, false)
	}

	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	/* Recursive allocation relies on functional tsd. */
	tsd = malloc_tsd_boot0();
	if (tsd == NULL) {
		return true;
	}
	if (malloc_init_hard_recursible()) {
		return true;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &init_lock);
	/* Set reentrancy level to 1 during init. */
	pre_reentrancy(tsd, NULL);
	/* Initialize narenas before prof_boot2 (for allocation). */
	if (malloc_init_narenas()
	    || background_thread_boot1(tsd_tsdn(tsd), b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	if (config_prof && prof_boot2(tsd, b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}

	malloc_init_percpu();

	if (malloc_init_hard_finish()) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	post_reentrancy(tsd);
	malloc_mutex_unlock(tsd_tsdn(tsd), &init_lock);

	witness_assert_lockless(witness_tsd_tsdn(
	    tsd_witness_tsdp_get_unsafe(tsd)));
	malloc_tsd_boot1();
	/* Update TSD after tsd_boot1. */
	tsd = tsd_fetch();
	if (opt_background_thread) {
		assert(have_background_thread);
		/*
		 * Need to finish init & unlock first before creating background
		 * threads (pthread_create depends on malloc).  ctl_init (which
		 * sets isthreaded) needs to be called without holding any lock.
		 */
		background_thread_ctl_init(tsd_tsdn(tsd));
		if (background_thread_create(tsd, 0)) {
			return true;
		}
	}
#undef UNLOCK_RETURN
	return false;
}

/*
 * End initialization functions.
 */
/******************************************************************************/
/*
 * Begin allocation-path internal functions and data structures.
 */

/*
 * Settings determined by the documented behavior of the allocation functions.
 */
typedef struct static_opts_s static_opts_t;
struct static_opts_s {
	/* Whether or not allocation size may overflow. */
	bool may_overflow;

	/*
	 * Whether or not allocations (with alignment) of size 0 should be
	 * treated as size 1.
	 */
	bool bump_empty_aligned_alloc;
	/*
	 * Whether to assert that allocations are not of size 0 (after any
	 * bumping).
	 */
	bool assert_nonempty_alloc;

	/*
	 * Whether or not to modify the 'result' argument to malloc in case of
	 * error.
	 */
	bool null_out_result_on_error;
	/* Whether to set errno when we encounter an error condition. */
	bool set_errno_on_error;

	/*
	 * The minimum valid alignment for functions requesting aligned storage.
	 */
	size_t min_alignment;

	/* The error string to use if we oom. */
	const char *oom_string;
	/* The error string to use if the passed-in alignment is invalid. */
	const char *invalid_alignment_string;

	/*
	 * False if we're configured to skip some time-consuming operations.
	 *
	 * This isn't really a malloc "behavior", but it acts as a useful
	 * summary of several other static (or at least, static after program
	 * initialization) options.
	 */
	bool slow;
	/*
	 * Return size.
	 */
	bool usize;
};

JEMALLOC_ALWAYS_INLINE void
static_opts_init(static_opts_t *static_opts) {
	static_opts->may_overflow = false;
	static_opts->bump_empty_aligned_alloc = false;
	static_opts->assert_nonempty_alloc = false;
	static_opts->null_out_result_on_error = false;
	static_opts->set_errno_on_error = false;
	static_opts->min_alignment = 0;
	static_opts->oom_string = "";
	static_opts->invalid_alignment_string = "";
	static_opts->slow = false;
	static_opts->usize = false;
}

typedef struct dynamic_opts_s dynamic_opts_t;
struct dynamic_opts_s {
	void **result;
	size_t usize;
	size_t num_items;
	size_t item_size;
	size_t alignment;
	bool zero;
	unsigned tcache_ind;
	unsigned arena_ind;
};

JEMALLOC_ALWAYS_INLINE void
dynamic_opts_init(dynamic_opts_t *dynamic_opts) {
	dynamic_opts->result = NULL;
	dynamic_opts->usize = 0;
	dynamic_opts->num_items = 0;
	dynamic_opts->item_size = 0;
	dynamic_opts->alignment = 0;
	dynamic_opts->zero = false;
	dynamic_opts->tcache_ind = TCACHE_IND_AUTOMATIC;
	dynamic_opts->arena_ind = ARENA_IND_AUTOMATIC;
}

/*
 * ind parameter is optional and is only checked and filled if alignment == 0;
 * return true if result is out of range.
 */
JEMALLOC_ALWAYS_INLINE bool
aligned_usize_get(size_t size, size_t alignment, size_t *usize, szind_t *ind,
    bool bump_empty_aligned_alloc) {
	assert(usize != NULL);
	if (alignment == 0) {
		if (ind != NULL) {
			*ind = sz_size2index(size);
			if (unlikely(*ind >= SC_NSIZES)) {
				return true;
			}
			*usize = sz_index2size(*ind);
			assert(*usize > 0 && *usize <= SC_LARGE_MAXCLASS);
			return false;
		}
		*usize = sz_s2u(size);
	} else {
		if (bump_empty_aligned_alloc && unlikely(size == 0)) {
			size = 1;
		}
		*usize = sz_sa2u(size, alignment);
	}
	if (unlikely(*usize == 0 || *usize > SC_LARGE_MAXCLASS)) {
		return true;
	}
	return false;
}

JEMALLOC_ALWAYS_INLINE bool
zero_get(bool guarantee, bool slow) {
	if (config_fill && slow && unlikely(opt_zero)) {
		return true;
	} else {
		return guarantee;
	}
}

/* Return true if a manual arena is specified and arena_get() OOMs. */
JEMALLOC_ALWAYS_INLINE bool
arena_get_from_ind(tsd_t *tsd, unsigned arena_ind, arena_t **arena_p) {
	if (arena_ind == ARENA_IND_AUTOMATIC) {
		/*
		 * In case of automatic arena management, we defer arena
		 * computation until as late as we can, hoping to fill the
		 * allocation out of the tcache.
		 */
		*arena_p = NULL;
	} else {
		*arena_p = arena_get(tsd_tsdn(tsd), arena_ind, true);
		if (unlikely(*arena_p == NULL) && arena_ind >= narenas_auto) {
			return true;
		}
	}
	return false;
}

/* ind is ignored if dopts->alignment > 0. */
JEMALLOC_ALWAYS_INLINE void *
imalloc_no_sample(static_opts_t *sopts, dynamic_opts_t *dopts, tsd_t *tsd,
    size_t size, size_t usize, szind_t ind, bool slab) {
	/* Fill in the tcache. */
	tcache_t *tcache = tcache_get_from_ind(tsd, dopts->tcache_ind,
	    sopts->slow, /* is_alloc */ true);

	/* Fill in the arena. */
	arena_t *arena;
	if (arena_get_from_ind(tsd, dopts->arena_ind, &arena)) {
		return NULL;
	}

	if (unlikely(dopts->alignment != 0)) {
		return ipalloct_explicit_slab(tsd_tsdn(tsd), usize,
		    dopts->alignment, dopts->zero, slab, tcache, arena);
	}

	return iallocztm_explicit_slab(tsd_tsdn(tsd), size, ind, dopts->zero,
	    slab, tcache, false, arena, sopts->slow);
}

JEMALLOC_ALWAYS_INLINE void *
imalloc_sample(static_opts_t *sopts, dynamic_opts_t *dopts, tsd_t *tsd,
    size_t usize, szind_t ind) {
	void *ret;

	dopts->alignment = prof_sample_align(usize, dopts->alignment);
	/*
	 * If the allocation is small enough that it would normally be allocated
	 * on a slab, we need to take additional steps to ensure that it gets
	 * its own extent instead.
	 */
	if (sz_can_use_slab(usize)) {
		assert((dopts->alignment & PROF_SAMPLE_ALIGNMENT_MASK) == 0);
		size_t bumped_usize = sz_sa2u(usize, dopts->alignment);
		szind_t bumped_ind = sz_size2index(bumped_usize);
		dopts->tcache_ind = TCACHE_IND_NONE;
		ret = imalloc_no_sample(sopts, dopts, tsd, bumped_usize,
		    bumped_usize, bumped_ind, /* slab */ false);
		if (unlikely(ret == NULL)) {
			return NULL;
		}
		arena_prof_promote(tsd_tsdn(tsd), ret, usize, bumped_usize);
	} else {
		ret = imalloc_no_sample(sopts, dopts, tsd, usize, usize, ind,
		    /* slab */ false);
	}
	assert(prof_sample_aligned(ret));

	return ret;
}

/*
 * Returns true if the allocation will overflow, and false otherwise.  Sets
 * *size to the product either way.
 */
JEMALLOC_ALWAYS_INLINE bool
compute_size_with_overflow(bool may_overflow, dynamic_opts_t *dopts,
    size_t *size) {
	/*
	 * This function is just num_items * item_size, except that we may have
	 * to check for overflow.
	 */

	if (!may_overflow) {
		assert(dopts->num_items == 1);
		*size = dopts->item_size;
		return false;
	}

	/* A size_t with its high-half bits all set to 1. */
	static const size_t high_bits = SIZE_T_MAX << (sizeof(size_t) * 8 / 2);

	*size = dopts->item_size * dopts->num_items;

	if (unlikely(*size == 0)) {
		return (dopts->num_items != 0 && dopts->item_size != 0);
	}

	/*
	 * We got a non-zero size, but we don't know if we overflowed to get
	 * there.  To avoid having to do a divide, we'll be clever and note that
	 * if both A and B can be represented in N/2 bits, then their product
	 * can be represented in N bits (without the possibility of overflow).
	 */
	if (likely((high_bits & (dopts->num_items | dopts->item_size)) == 0)) {
		return false;
	}
	if (likely(*size / dopts->item_size == dopts->num_items)) {
		return false;
	}
	return true;
}

JEMALLOC_ALWAYS_INLINE int
imalloc_body(static_opts_t *sopts, dynamic_opts_t *dopts, tsd_t *tsd) {
	/* Where the actual allocated memory will live. */
	void *allocation = NULL;
	/* Filled in by compute_size_with_overflow below. */
	size_t size = 0;
	/*
	 * The zero initialization for ind is actually dead store, in that its
	 * value is reset before any branch on its value is taken.  Sometimes
	 * though, it's convenient to pass it as arguments before this point.
	 * To avoid undefined behavior then, we initialize it with dummy stores.
	 */
	szind_t ind = 0;
	/* usize will always be properly initialized. */
	size_t usize;

	/* Reentrancy is only checked on slow path. */
	int8_t reentrancy_level;

	/* Compute the amount of memory the user wants. */
	if (unlikely(compute_size_with_overflow(sopts->may_overflow, dopts,
	    &size))) {
		goto label_oom;
	}

	if (unlikely(dopts->alignment < sopts->min_alignment
	    || (dopts->alignment & (dopts->alignment - 1)) != 0)) {
		goto label_invalid_alignment;
	}

	/* This is the beginning of the "core" algorithm. */
	dopts->zero = zero_get(dopts->zero, sopts->slow);
	if (aligned_usize_get(size, dopts->alignment, &usize, &ind,
	    sopts->bump_empty_aligned_alloc)) {
		goto label_oom;
	}
	dopts->usize = usize;
	/* Validate the user input. */
	if (sopts->assert_nonempty_alloc) {
		assert (size != 0);
	}

	check_entry_exit_locking(tsd_tsdn(tsd));

	/*
	 * If we need to handle reentrancy, we can do it out of a
	 * known-initialized arena (i.e. arena 0).
	 */
	reentrancy_level = tsd_reentrancy_level_get(tsd);
	if (sopts->slow && unlikely(reentrancy_level > 0)) {
		/*
		 * We should never specify particular arenas or tcaches from
		 * within our internal allocations.
		 */
		assert(dopts->tcache_ind == TCACHE_IND_AUTOMATIC ||
		    dopts->tcache_ind == TCACHE_IND_NONE);
		assert(dopts->arena_ind == ARENA_IND_AUTOMATIC);
		dopts->tcache_ind = TCACHE_IND_NONE;
		/* We know that arena 0 has already been initialized. */
		dopts->arena_ind = 0;
	}

	/*
	 * If dopts->alignment > 0, then ind is still 0, but usize was computed
	 * in the previous if statement.  Down the positive alignment path,
	 * imalloc_no_sample and imalloc_sample will ignore ind.
	 */

	/* If profiling is on, get our profiling context. */
	if (config_prof && opt_prof) {
		bool prof_active = prof_active_get_unlocked();
		bool sample_event = te_prof_sample_event_lookahead(tsd, usize);
		prof_tctx_t *tctx = prof_alloc_prep(tsd, prof_active,
		    sample_event);

		emap_alloc_ctx_t alloc_ctx;
		if (likely(tctx == PROF_TCTX_SENTINEL)) {
			alloc_ctx.slab = sz_can_use_slab(usize);
			allocation = imalloc_no_sample(
			    sopts, dopts, tsd, usize, usize, ind,
			    alloc_ctx.slab);
		} else if (tctx != NULL) {
			allocation = imalloc_sample(
			    sopts, dopts, tsd, usize, ind);
			alloc_ctx.slab = false;
		} else {
			allocation = NULL;
		}

		if (unlikely(allocation == NULL)) {
			prof_alloc_rollback(tsd, tctx);
			goto label_oom;
		}
		prof_malloc(tsd, allocation, size, usize, &alloc_ctx, tctx);
	} else {
		assert(!opt_prof);
		allocation = imalloc_no_sample(sopts, dopts, tsd, size, usize,
		    ind, sz_can_use_slab(usize));
		if (unlikely(allocation == NULL)) {
			goto label_oom;
		}
	}

	/*
	 * Allocation has been done at this point.  We still have some
	 * post-allocation work to do though.
	 */

	thread_alloc_event(tsd, usize);

	assert(dopts->alignment == 0
	    || ((uintptr_t)allocation & (dopts->alignment - 1)) == ZU(0));

	assert(usize == isalloc(tsd_tsdn(tsd), allocation));

	if (config_fill && sopts->slow && !dopts->zero
	    && unlikely(opt_junk_alloc)) {
		junk_alloc_callback(allocation, usize);
	}

	if (sopts->slow) {
		UTRACE(0, size, allocation);
	}

	/* Success! */
	check_entry_exit_locking(tsd_tsdn(tsd));
	*dopts->result = allocation;
	return 0;

label_oom:
	if (unlikely(sopts->slow) && config_xmalloc && unlikely(opt_xmalloc)) {
		malloc_write(sopts->oom_string);
		abort();
	}

	if (sopts->slow) {
		UTRACE(NULL, size, NULL);
	}

	check_entry_exit_locking(tsd_tsdn(tsd));

	if (sopts->set_errno_on_error) {
		set_errno(ENOMEM);
	}

	if (sopts->null_out_result_on_error) {
		*dopts->result = NULL;
	}

	return ENOMEM;

	/*
	 * This label is only jumped to by one goto; we move it out of line
	 * anyways to avoid obscuring the non-error paths, and for symmetry with
	 * the oom case.
	 */
label_invalid_alignment:
	if (config_xmalloc && unlikely(opt_xmalloc)) {
		malloc_write(sopts->invalid_alignment_string);
		abort();
	}

	if (sopts->set_errno_on_error) {
		set_errno(EINVAL);
	}

	if (sopts->slow) {
		UTRACE(NULL, size, NULL);
	}

	check_entry_exit_locking(tsd_tsdn(tsd));

	if (sopts->null_out_result_on_error) {
		*dopts->result = NULL;
	}

	return EINVAL;
}

JEMALLOC_ALWAYS_INLINE bool
imalloc_init_check(static_opts_t *sopts, dynamic_opts_t *dopts) {
	if (unlikely(!malloc_initialized()) && unlikely(malloc_init())) {
		if (config_xmalloc && unlikely(opt_xmalloc)) {
			malloc_write(sopts->oom_string);
			abort();
		}
		UTRACE(NULL, dopts->num_items * dopts->item_size, NULL);
		set_errno(ENOMEM);
		*dopts->result = NULL;

		return false;
	}

	return true;
}

/* Returns the errno-style error code of the allocation. */
JEMALLOC_ALWAYS_INLINE int
imalloc(static_opts_t *sopts, dynamic_opts_t *dopts) {
	if (tsd_get_allocates() && !imalloc_init_check(sopts, dopts)) {
		return ENOMEM;
	}

	/* We always need the tsd.  Let's grab it right away. */
	tsd_t *tsd = tsd_fetch();
	assert(tsd);
	if (likely(tsd_fast(tsd))) {
		/* Fast and common path. */
		tsd_assert_fast(tsd);
		sopts->slow = false;
		return imalloc_body(sopts, dopts, tsd);
	} else {
		if (!tsd_get_allocates() && !imalloc_init_check(sopts, dopts)) {
			return ENOMEM;
		}

		sopts->slow = true;
		return imalloc_body(sopts, dopts, tsd);
	}
}

JEMALLOC_NOINLINE
void *
malloc_default(size_t size) {
	void *ret;
	static_opts_t sopts;
	dynamic_opts_t dopts;

	/*
	 * This variant has logging hook on exit but not on entry.  It's callled
	 * only by je_malloc, below, which emits the entry one for us (and, if
	 * it calls us, does so only via tail call).
	 */

	static_opts_init(&sopts);
	dynamic_opts_init(&dopts);

	sopts.null_out_result_on_error = true;
	sopts.set_errno_on_error = true;
	sopts.oom_string = "<jemalloc>: Error in malloc(): out of memory\n";

	dopts.result = &ret;
	dopts.num_items = 1;
	dopts.item_size = size;

	imalloc(&sopts, &dopts);
	/*
	 * Note that this branch gets optimized away -- it immediately follows
	 * the check on tsd_fast that sets sopts.slow.
	 */
	if (sopts.slow) {
		uintptr_t args[3] = {size};
		hook_invoke_alloc(hook_alloc_malloc, ret, (uintptr_t)ret, args);
	}

	return ret;
}

/******************************************************************************/
/*
 * Begin malloc(3)-compatible functions.
 */

JEMALLOC_EXPORT JEMALLOC_ALLOCATOR JEMALLOC_RESTRICT_RETURN
void JEMALLOC_NOTHROW *
JEMALLOC_ATTR(malloc) JEMALLOC_ALLOC_SIZE(1)
je_malloc(size_t size) {
	LOG("core.malloc.entry", "size: %zu", size);

	void * ret = imalloc_fastpath(size, &malloc_default);

	LOG("core.malloc.exit", "result: %p", ret);
	return ret;
}

JEMALLOC_EXPORT int JEMALLOC_NOTHROW
JEMALLOC_ATTR(nonnull(1))
je_posix_memalign(void **memptr, size_t alignment, size_t size) {
	int ret;
	static_opts_t sopts;
	dynamic_opts_t dopts;

	LOG("core.posix_memalign.entry", "mem ptr: %p, alignment: %zu, "
	    "size: %zu", memptr, alignment, size);

	static_opts_init(&sopts);
	dynamic_opts_init(&dopts);

	sopts.bump_empty_aligned_alloc = true;
	sopts.min_alignment = sizeof(void *);
	sopts.oom_string =
	    "<jemalloc>: Error allocating aligned memory: out of memory\n";
	sopts.invalid_alignment_string =
	    "<jemalloc>: Error allocating aligned memory: invalid alignment\n";

	dopts.result = memptr;
	dopts.num_items = 1;
	dopts.item_size = size;
	dopts.alignment = alignment;

	ret = imalloc(&sopts, &dopts);
	if (sopts.slow) {
		uintptr_t args[3] = {(uintptr_t)memptr, (uintptr_t)alignment,
			(uintptr_t)size};
		hook_invoke_alloc(hook_alloc_posix_memalign, *memptr,
		    (uintptr_t)ret, args);
	}

	LOG("core.posix_memalign.exit", "result: %d, alloc ptr: %p", ret,
	    *memptr);

	return ret;
}